

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  void *pvVar14;
  __int_type_conflict _Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  uint uVar60;
  uint uVar61;
  long lVar62;
  byte bVar63;
  uint uVar64;
  undefined4 uVar65;
  undefined8 unaff_RBP;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  float t1;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar94;
  float fVar96;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar95;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar97;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar89 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar113 [16];
  float fVar98;
  undefined8 uVar99;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 extraout_var [56];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar152;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vfloat4 b0;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar168;
  float fVar182;
  float fVar183;
  vfloat4 b0_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar184;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar186 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar198;
  undefined1 auVar196 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar202;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar212;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar213;
  vfloat4 a0_2;
  float fVar229;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar226 [32];
  float fVar228;
  undefined1 in_ZMM9 [64];
  undefined1 auVar227 [64];
  vfloat4 a0_3;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  vfloat4 a0_1;
  undefined1 auVar254 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar253 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar274;
  float fVar275;
  vfloat4 a0;
  undefined1 auVar263 [16];
  float fVar276;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar293 [32];
  vfloat_impl<4> p00;
  undefined1 local_618 [8];
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  undefined1 local_568 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_528 [16];
  undefined1 (*local_510) [16];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  RTCFilterFunctionNArguments args;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined4 local_428;
  undefined4 local_418;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  uint mask_stack [4];
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_268 [16];
  undefined1 local_258 [16];
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint uStack_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar119 [64];
  undefined1 auVar292 [32];
  
  PVar10 = prim[1];
  uVar66 = (ulong)(byte)PVar10;
  fVar69 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar113 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar113 = vsubps_avx(auVar113,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar73._0_4_ = fVar69 * auVar113._0_4_;
  auVar73._4_4_ = fVar69 * auVar113._4_4_;
  auVar73._8_4_ = fVar69 * auVar113._8_4_;
  auVar73._12_4_ = fVar69 * auVar113._12_4_;
  auVar153._0_4_ = fVar69 * auVar16._0_4_;
  auVar153._4_4_ = fVar69 * auVar16._4_4_;
  auVar153._8_4_ = fVar69 * auVar16._8_4_;
  auVar153._12_4_ = fVar69 * auVar16._12_4_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar66 * 4 + 6);
  auVar90 = vpmovsxbd_avx2(auVar113);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar66 * 5 + 6);
  auVar18 = vpmovsxbd_avx2(auVar16);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar66 * 6 + 6);
  auVar19 = vpmovsxbd_avx2(auVar4);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar20 = vpmovsxbd_avx2(auVar5);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar66 * 0xc + 6);
  auVar21 = vpmovsxbd_avx2(auVar6);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar22 = vpmovsxbd_avx2(auVar7);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar23 = vpmovsxbd_avx2(auVar8);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *(ulong *)(prim + uVar66 * 0x13 + 6);
  auVar24 = vpmovsxbd_avx2(auVar231);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar66 * 0x14 + 6);
  auVar261 = vpmovsxbd_avx2(auVar9);
  auVar261 = vcvtdq2ps_avx(auVar261);
  auVar281._4_4_ = auVar153._0_4_;
  auVar281._0_4_ = auVar153._0_4_;
  auVar281._8_4_ = auVar153._0_4_;
  auVar281._12_4_ = auVar153._0_4_;
  auVar281._16_4_ = auVar153._0_4_;
  auVar281._20_4_ = auVar153._0_4_;
  auVar281._24_4_ = auVar153._0_4_;
  auVar281._28_4_ = auVar153._0_4_;
  auVar113 = vmovshdup_avx(auVar153);
  uVar99 = auVar113._0_8_;
  auVar290._8_8_ = uVar99;
  auVar290._0_8_ = uVar99;
  auVar290._16_8_ = uVar99;
  auVar290._24_8_ = uVar99;
  auVar113 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar69 = auVar113._0_4_;
  auVar245._0_4_ = fVar69 * auVar19._0_4_;
  fVar94 = auVar113._4_4_;
  auVar245._4_4_ = fVar94 * auVar19._4_4_;
  auVar245._8_4_ = fVar69 * auVar19._8_4_;
  auVar245._12_4_ = fVar94 * auVar19._12_4_;
  auVar245._16_4_ = fVar69 * auVar19._16_4_;
  auVar245._20_4_ = fVar94 * auVar19._20_4_;
  auVar245._28_36_ = in_ZMM10._28_36_;
  auVar245._24_4_ = fVar69 * auVar19._24_4_;
  auVar227._0_4_ = auVar22._0_4_ * fVar69;
  auVar227._4_4_ = auVar22._4_4_ * fVar94;
  auVar227._8_4_ = auVar22._8_4_ * fVar69;
  auVar227._12_4_ = auVar22._12_4_ * fVar94;
  auVar227._16_4_ = auVar22._16_4_ * fVar69;
  auVar227._20_4_ = auVar22._20_4_ * fVar94;
  auVar227._28_36_ = in_ZMM9._28_36_;
  auVar227._24_4_ = auVar22._24_4_ * fVar69;
  auVar209._0_4_ = auVar261._0_4_ * fVar69;
  auVar209._4_4_ = auVar261._4_4_ * fVar94;
  auVar209._8_4_ = auVar261._8_4_ * fVar69;
  auVar209._12_4_ = auVar261._12_4_ * fVar94;
  auVar209._16_4_ = auVar261._16_4_ * fVar69;
  auVar209._20_4_ = auVar261._20_4_ * fVar94;
  auVar209._24_4_ = auVar261._24_4_ * fVar69;
  auVar209._28_4_ = 0;
  auVar113 = vfmadd231ps_fma(auVar245._0_32_,auVar290,auVar18);
  auVar16 = vfmadd231ps_fma(auVar227._0_32_,auVar290,auVar21);
  auVar4 = vfmadd231ps_fma(auVar209,auVar24,auVar290);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar281,auVar90);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar281,auVar20);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar23,auVar281);
  auVar282._4_4_ = auVar73._0_4_;
  auVar282._0_4_ = auVar73._0_4_;
  auVar282._8_4_ = auVar73._0_4_;
  auVar282._12_4_ = auVar73._0_4_;
  auVar282._16_4_ = auVar73._0_4_;
  auVar282._20_4_ = auVar73._0_4_;
  auVar282._24_4_ = auVar73._0_4_;
  auVar282._28_4_ = auVar73._0_4_;
  auVar113 = vmovshdup_avx(auVar73);
  uVar99 = auVar113._0_8_;
  auVar291._8_8_ = uVar99;
  auVar291._0_8_ = uVar99;
  auVar291._16_8_ = uVar99;
  auVar291._24_8_ = uVar99;
  auVar113 = vshufps_avx(auVar73,auVar73,0xaa);
  fVar69 = auVar113._0_4_;
  auVar166._0_4_ = fVar69 * auVar19._0_4_;
  fVar94 = auVar113._4_4_;
  auVar166._4_4_ = fVar94 * auVar19._4_4_;
  auVar166._8_4_ = fVar69 * auVar19._8_4_;
  auVar166._12_4_ = fVar94 * auVar19._12_4_;
  auVar166._16_4_ = fVar69 * auVar19._16_4_;
  auVar166._20_4_ = fVar94 * auVar19._20_4_;
  auVar166._24_4_ = fVar69 * auVar19._24_4_;
  auVar166._28_4_ = 0;
  auVar27._4_4_ = auVar22._4_4_ * fVar94;
  auVar27._0_4_ = auVar22._0_4_ * fVar69;
  auVar27._8_4_ = auVar22._8_4_ * fVar69;
  auVar27._12_4_ = auVar22._12_4_ * fVar94;
  auVar27._16_4_ = auVar22._16_4_ * fVar69;
  auVar27._20_4_ = auVar22._20_4_ * fVar94;
  auVar27._24_4_ = auVar22._24_4_ * fVar69;
  auVar27._28_4_ = auVar19._28_4_;
  auVar19._4_4_ = auVar261._4_4_ * fVar94;
  auVar19._0_4_ = auVar261._0_4_ * fVar69;
  auVar19._8_4_ = auVar261._8_4_ * fVar69;
  auVar19._12_4_ = auVar261._12_4_ * fVar94;
  auVar19._16_4_ = auVar261._16_4_ * fVar69;
  auVar19._20_4_ = auVar261._20_4_ * fVar94;
  auVar19._24_4_ = auVar261._24_4_ * fVar69;
  auVar19._28_4_ = fVar94;
  auVar113 = vfmadd231ps_fma(auVar166,auVar291,auVar18);
  auVar6 = vfmadd231ps_fma(auVar27,auVar291,auVar21);
  auVar7 = vfmadd231ps_fma(auVar19,auVar291,auVar24);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar282,auVar90);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar282,auVar20);
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar192._16_4_ = 0x219392ef;
  auVar192._20_4_ = 0x219392ef;
  auVar192._24_4_ = 0x219392ef;
  auVar192._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(ZEXT1632(auVar5),auVar129);
  auVar90 = vcmpps_avx(auVar90,auVar192,1);
  auVar18 = vblendvps_avx(ZEXT1632(auVar5),auVar192,auVar90);
  auVar90 = vandps_avx(ZEXT1632(auVar16),auVar129);
  auVar90 = vcmpps_avx(auVar90,auVar192,1);
  auVar19 = vblendvps_avx(ZEXT1632(auVar16),auVar192,auVar90);
  auVar90 = vandps_avx(ZEXT1632(auVar4),auVar129);
  auVar90 = vcmpps_avx(auVar90,auVar192,1);
  auVar90 = vblendvps_avx(ZEXT1632(auVar4),auVar192,auVar90);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar282,auVar23);
  auVar20 = vrcpps_avx(auVar18);
  auVar193._8_4_ = 0x3f800000;
  auVar193._0_8_ = 0x3f8000003f800000;
  auVar193._12_4_ = 0x3f800000;
  auVar193._16_4_ = 0x3f800000;
  auVar193._20_4_ = 0x3f800000;
  auVar193._24_4_ = 0x3f800000;
  auVar193._28_4_ = 0x3f800000;
  auVar113 = vfnmadd213ps_fma(auVar18,auVar20,auVar193);
  auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar20,auVar20);
  auVar18 = vrcpps_avx(auVar19);
  auVar16 = vfnmadd213ps_fma(auVar19,auVar18,auVar193);
  auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar18,auVar18);
  auVar18 = vrcpps_avx(auVar90);
  auVar4 = vfnmadd213ps_fma(auVar90,auVar18,auVar193);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 7 + 6));
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar18,auVar18);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar8));
  auVar20._4_4_ = auVar113._4_4_ * auVar90._4_4_;
  auVar20._0_4_ = auVar113._0_4_ * auVar90._0_4_;
  auVar20._8_4_ = auVar113._8_4_ * auVar90._8_4_;
  auVar20._12_4_ = auVar113._12_4_ * auVar90._12_4_;
  auVar20._16_4_ = auVar90._16_4_ * 0.0;
  auVar20._20_4_ = auVar90._20_4_ * 0.0;
  auVar20._24_4_ = auVar90._24_4_ * 0.0;
  auVar20._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 9 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar8));
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0xe + 6));
  auVar21._4_4_ = auVar113._4_4_ * auVar90._4_4_;
  auVar21._0_4_ = auVar113._0_4_ * auVar90._0_4_;
  auVar21._8_4_ = auVar113._8_4_ * auVar90._8_4_;
  auVar21._12_4_ = auVar113._12_4_ * auVar90._12_4_;
  auVar21._16_4_ = auVar90._16_4_ * 0.0;
  auVar21._20_4_ = auVar90._20_4_ * 0.0;
  auVar21._24_4_ = auVar90._24_4_ * 0.0;
  auVar21._28_4_ = auVar90._28_4_;
  auVar90 = vcvtdq2ps_avx(auVar18);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar6));
  auVar22._4_4_ = auVar16._4_4_ * auVar90._4_4_;
  auVar22._0_4_ = auVar16._0_4_ * auVar90._0_4_;
  auVar22._8_4_ = auVar16._8_4_ * auVar90._8_4_;
  auVar22._12_4_ = auVar16._12_4_ * auVar90._12_4_;
  auVar22._16_4_ = auVar90._16_4_ * 0.0;
  auVar22._20_4_ = auVar90._20_4_ * 0.0;
  auVar22._24_4_ = auVar90._24_4_ * 0.0;
  auVar22._28_4_ = auVar90._28_4_;
  auVar114._1_3_ = 0;
  auVar114[0] = PVar10;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar10 * 0x10 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar6));
  auVar23._4_4_ = auVar16._4_4_ * auVar90._4_4_;
  auVar23._0_4_ = auVar16._0_4_ * auVar90._0_4_;
  auVar23._8_4_ = auVar16._8_4_ * auVar90._8_4_;
  auVar23._12_4_ = auVar16._12_4_ * auVar90._12_4_;
  auVar23._16_4_ = auVar90._16_4_ * 0.0;
  auVar23._20_4_ = auVar90._20_4_ * 0.0;
  auVar23._24_4_ = auVar90._24_4_ * 0.0;
  auVar23._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x15 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar5));
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x17 + 6));
  auVar24._4_4_ = auVar90._4_4_ * auVar4._4_4_;
  auVar24._0_4_ = auVar90._0_4_ * auVar4._0_4_;
  auVar24._8_4_ = auVar90._8_4_ * auVar4._8_4_;
  auVar24._12_4_ = auVar90._12_4_ * auVar4._12_4_;
  auVar24._16_4_ = auVar90._16_4_ * 0.0;
  auVar24._20_4_ = auVar90._20_4_ * 0.0;
  auVar24._24_4_ = auVar90._24_4_ * 0.0;
  auVar24._28_4_ = auVar90._28_4_;
  auVar90 = vcvtdq2ps_avx(auVar18);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar5));
  auVar261._4_4_ = auVar4._4_4_ * auVar90._4_4_;
  auVar261._0_4_ = auVar4._0_4_ * auVar90._0_4_;
  auVar261._8_4_ = auVar4._8_4_ * auVar90._8_4_;
  auVar261._12_4_ = auVar4._12_4_ * auVar90._12_4_;
  auVar261._16_4_ = auVar90._16_4_ * 0.0;
  auVar261._20_4_ = auVar90._20_4_ * 0.0;
  auVar261._24_4_ = auVar90._24_4_ * 0.0;
  auVar261._28_4_ = auVar90._28_4_;
  auVar90 = vpminsd_avx2(auVar20,auVar21);
  auVar18 = vpminsd_avx2(auVar22,auVar23);
  auVar90 = vmaxps_avx(auVar90,auVar18);
  auVar18 = vpminsd_avx2(auVar24,auVar261);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar225._4_4_ = uVar65;
  auVar225._0_4_ = uVar65;
  auVar225._8_4_ = uVar65;
  auVar225._12_4_ = uVar65;
  auVar225._16_4_ = uVar65;
  auVar225._20_4_ = uVar65;
  auVar225._24_4_ = uVar65;
  auVar225._28_4_ = uVar65;
  auVar18 = vmaxps_avx(auVar18,auVar225);
  auVar90 = vmaxps_avx(auVar90,auVar18);
  local_1d8._4_4_ = auVar90._4_4_ * 0.99999964;
  local_1d8._0_4_ = auVar90._0_4_ * 0.99999964;
  local_1d8._8_4_ = auVar90._8_4_ * 0.99999964;
  local_1d8._12_4_ = auVar90._12_4_ * 0.99999964;
  local_1d8._16_4_ = auVar90._16_4_ * 0.99999964;
  local_1d8._20_4_ = auVar90._20_4_ * 0.99999964;
  local_1d8._24_4_ = auVar90._24_4_ * 0.99999964;
  local_1d8._28_4_ = 0x3f7ffffa;
  auVar90 = vpmaxsd_avx2(auVar20,auVar21);
  auVar18 = vpmaxsd_avx2(auVar22,auVar23);
  auVar90 = vminps_avx(auVar90,auVar18);
  uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar130._4_4_ = uVar65;
  auVar130._0_4_ = uVar65;
  auVar130._8_4_ = uVar65;
  auVar130._12_4_ = uVar65;
  auVar130._16_4_ = uVar65;
  auVar130._20_4_ = uVar65;
  auVar130._24_4_ = uVar65;
  auVar130._28_4_ = uVar65;
  auVar18 = vpmaxsd_avx2(auVar24,auVar261);
  auVar18 = vminps_avx(auVar18,auVar130);
  auVar90 = vminps_avx(auVar90,auVar18);
  auVar18._4_4_ = auVar90._4_4_ * 1.0000004;
  auVar18._0_4_ = auVar90._0_4_ * 1.0000004;
  auVar18._8_4_ = auVar90._8_4_ * 1.0000004;
  auVar18._12_4_ = auVar90._12_4_ * 1.0000004;
  auVar18._16_4_ = auVar90._16_4_ * 1.0000004;
  auVar18._20_4_ = auVar90._20_4_ * 1.0000004;
  auVar18._24_4_ = auVar90._24_4_ * 1.0000004;
  auVar18._28_4_ = auVar90._28_4_;
  auVar114[4] = PVar10;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar10;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar10;
  auVar114._13_3_ = 0;
  auVar114[0x10] = PVar10;
  auVar114._17_3_ = 0;
  auVar114[0x14] = PVar10;
  auVar114._21_3_ = 0;
  auVar114[0x18] = PVar10;
  auVar114._25_3_ = 0;
  auVar114[0x1c] = PVar10;
  auVar114._29_3_ = 0;
  auVar90 = vcmpps_avx(local_1d8,auVar18,2);
  auVar18 = vpcmpgtd_avx2(auVar114,_DAT_01fb4ba0);
  auVar90 = vandps_avx(auVar90,auVar18);
  uVar65 = vmovmskps_avx(auVar90);
  uVar66 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar65);
  auVar90._16_16_ = mm_lookupmask_ps._240_16_;
  auVar90._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar90,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_0135a6cb:
  if (uVar66 == 0) {
    return;
  }
  lVar62 = 0;
  for (uVar68 = uVar66; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar62 = lVar62 + 1;
  }
  uVar61 = *(uint *)(prim + 2);
  uVar11 = *(uint *)(prim + lVar62 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar61].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar11);
  p_Var13 = pGVar12[1].intersectionFilterN;
  pvVar14 = pGVar12[2].userPtr;
  _Var15 = pGVar12[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar7 = *(undefined1 (*) [16])(_Var15 + uVar68 * (long)pvVar14);
  auVar113 = *(undefined1 (*) [16])(_Var15 + (uVar68 + 1) * (long)pvVar14);
  auVar16 = *(undefined1 (*) [16])(_Var15 + (uVar68 + 2) * (long)pvVar14);
  pfVar1 = (float *)(_Var15 + (long)pvVar14 * (uVar68 + 3));
  fVar69 = *pfVar1;
  fVar94 = pfVar1[1];
  fVar72 = pfVar1[2];
  fVar98 = pfVar1[3];
  lVar62 = *(long *)&pGVar12[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar62 + (long)p_Var13 * uVar68);
  auVar5 = *(undefined1 (*) [16])(lVar62 + (long)p_Var13 * (uVar68 + 1));
  auVar6 = *(undefined1 (*) [16])(lVar62 + (long)p_Var13 * (uVar68 + 2));
  uVar66 = uVar66 - 1 & uVar66;
  pfVar1 = (float *)(lVar62 + (long)p_Var13 * (uVar68 + 3));
  fVar168 = *pfVar1;
  fVar182 = pfVar1[1];
  fVar183 = pfVar1[2];
  fVar184 = pfVar1[3];
  if (uVar66 != 0) {
    uVar67 = uVar66 - 1 & uVar66;
    for (uVar68 = uVar66; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    }
    if (uVar67 != 0) {
      for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar285._8_4_ = 0x80000000;
  auVar285._0_8_ = 0x8000000080000000;
  auVar285._12_4_ = 0x80000000;
  auVar132._0_4_ = fVar168 * -0.0;
  auVar132._4_4_ = fVar182 * -0.0;
  auVar132._8_4_ = fVar183 * -0.0;
  auVar132._12_4_ = fVar184 * -0.0;
  auVar231 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar6,auVar132);
  auVar74._0_4_ = auVar5._0_4_ + auVar231._0_4_;
  auVar74._4_4_ = auVar5._4_4_ + auVar231._4_4_;
  auVar74._8_4_ = auVar5._8_4_ + auVar231._8_4_;
  auVar74._12_4_ = auVar5._12_4_ + auVar231._12_4_;
  auVar9 = vfmadd231ps_fma(auVar74,auVar4,auVar285);
  auVar100._12_4_ = 0;
  auVar100._0_12_ = ZEXT812(0);
  auVar100 = auVar100 << 0x20;
  auVar120._0_4_ = fVar168 * 0.0;
  auVar120._4_4_ = fVar182 * 0.0;
  auVar120._8_4_ = fVar183 * 0.0;
  auVar120._12_4_ = fVar184 * 0.0;
  auVar203._8_4_ = 0x3f000000;
  auVar203._0_8_ = 0x3f0000003f000000;
  auVar203._12_4_ = 0x3f000000;
  auVar231 = vfmadd231ps_fma(auVar120,auVar6,auVar203);
  auVar231 = vfmadd231ps_fma(auVar231,auVar5,auVar100);
  auVar74 = vfnmadd231ps_fma(auVar231,auVar4,auVar203);
  auVar277._0_4_ = fVar69 * -0.0;
  auVar277._4_4_ = fVar94 * -0.0;
  auVar277._8_4_ = fVar72 * -0.0;
  auVar277._12_4_ = fVar98 * -0.0;
  auVar231 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar16,auVar277);
  auVar263._0_4_ = auVar113._0_4_ + auVar231._0_4_;
  auVar263._4_4_ = auVar113._4_4_ + auVar231._4_4_;
  auVar263._8_4_ = auVar113._8_4_ + auVar231._8_4_;
  auVar263._12_4_ = auVar113._12_4_ + auVar231._12_4_;
  auVar231 = vfmadd231ps_fma(auVar263,auVar7,auVar285);
  auVar251._0_4_ = fVar69 * 0.0;
  auVar251._4_4_ = fVar94 * 0.0;
  auVar251._8_4_ = fVar72 * 0.0;
  auVar251._12_4_ = fVar98 * 0.0;
  auVar73 = vfmadd231ps_fma(auVar251,auVar16,auVar203);
  auVar73 = vfmadd231ps_fma(auVar73,auVar113,auVar100);
  auVar102 = vfnmadd231ps_fma(auVar73,auVar7,auVar203);
  auVar133._0_4_ = auVar6._0_4_ + auVar132._0_4_;
  auVar133._4_4_ = auVar6._4_4_ + auVar132._4_4_;
  auVar133._8_4_ = auVar6._8_4_ + auVar132._8_4_;
  auVar133._12_4_ = auVar6._12_4_ + auVar132._12_4_;
  auVar73 = vfmadd231ps_fma(auVar133,auVar5,auVar100);
  auVar73 = vfmadd231ps_fma(auVar73,auVar4,auVar285);
  auVar144._0_4_ = fVar168 * 0.5;
  auVar144._4_4_ = fVar182 * 0.5;
  auVar144._8_4_ = fVar183 * 0.5;
  auVar144._12_4_ = fVar184 * 0.5;
  auVar6 = vfmadd231ps_fma(auVar144,auVar100,auVar6);
  auVar5 = vfnmadd231ps_fma(auVar6,auVar203,auVar5);
  auVar153 = vfmadd231ps_fma(auVar5,auVar100,auVar4);
  auVar214._0_4_ = auVar277._0_4_ + auVar16._0_4_;
  auVar214._4_4_ = auVar277._4_4_ + auVar16._4_4_;
  auVar214._8_4_ = auVar277._8_4_ + auVar16._8_4_;
  auVar214._12_4_ = auVar277._12_4_ + auVar16._12_4_;
  auVar4 = vfmadd231ps_fma(auVar214,auVar113,auVar100);
  auVar6 = vfmadd231ps_fma(auVar4,auVar7,auVar285);
  auVar230._0_4_ = fVar69 * 0.5;
  auVar230._4_4_ = fVar94 * 0.5;
  auVar230._8_4_ = fVar72 * 0.5;
  auVar230._12_4_ = fVar98 * 0.5;
  auVar16 = vfmadd231ps_fma(auVar230,auVar100,auVar16);
  auVar113 = vfnmadd231ps_fma(auVar16,auVar203,auVar113);
  auVar77 = vfmadd231ps_fma(auVar113,auVar100,auVar7);
  auVar113 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar16 = vshufps_avx(auVar231,auVar231,0xc9);
  fVar131 = auVar74._0_4_;
  auVar169._0_4_ = fVar131 * auVar16._0_4_;
  fVar95 = auVar74._4_4_;
  auVar169._4_4_ = fVar95 * auVar16._4_4_;
  fVar96 = auVar74._8_4_;
  auVar169._8_4_ = fVar96 * auVar16._8_4_;
  fVar71 = auVar74._12_4_;
  auVar169._12_4_ = fVar71 * auVar16._12_4_;
  auVar16 = vfmsub231ps_fma(auVar169,auVar113,auVar231);
  auVar4 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar16 = vshufps_avx(auVar102,auVar102,0xc9);
  auVar170._0_4_ = fVar131 * auVar16._0_4_;
  auVar170._4_4_ = fVar95 * auVar16._4_4_;
  auVar170._8_4_ = fVar96 * auVar16._8_4_;
  auVar170._12_4_ = fVar71 * auVar16._12_4_;
  auVar113 = vfmsub231ps_fma(auVar170,auVar113,auVar102);
  auVar5 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar16 = vshufps_avx(auVar153,auVar153,0xc9);
  auVar113 = vshufps_avx(auVar6,auVar6,0xc9);
  fVar70 = auVar153._0_4_;
  auVar154._0_4_ = fVar70 * auVar113._0_4_;
  fVar229 = auVar153._4_4_;
  auVar154._4_4_ = fVar229 * auVar113._4_4_;
  fVar143 = auVar153._8_4_;
  auVar154._8_4_ = fVar143 * auVar113._8_4_;
  fVar152 = auVar153._12_4_;
  auVar154._12_4_ = fVar152 * auVar113._12_4_;
  auVar113 = vfmsub231ps_fma(auVar154,auVar16,auVar6);
  auVar6 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar7 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar113 = vdpps_avx(auVar4,auVar4,0x7f);
  auVar136._0_4_ = fVar70 * auVar7._0_4_;
  auVar136._4_4_ = fVar229 * auVar7._4_4_;
  auVar136._8_4_ = fVar143 * auVar7._8_4_;
  auVar136._12_4_ = fVar152 * auVar7._12_4_;
  auVar16 = vfmsub231ps_fma(auVar136,auVar16,auVar77);
  auVar7 = vshufps_avx(auVar16,auVar16,0xc9);
  fVar94 = auVar113._0_4_;
  auVar231 = ZEXT416((uint)fVar94);
  auVar16 = vrsqrtss_avx(auVar231,auVar231);
  fVar69 = auVar16._0_4_;
  fVar69 = fVar69 * 1.5 + fVar94 * -0.5 * fVar69 * fVar69 * fVar69;
  auVar16 = vdpps_avx(auVar4,auVar5,0x7f);
  fVar168 = auVar4._0_4_ * fVar69;
  fVar182 = auVar4._4_4_ * fVar69;
  fVar183 = auVar4._8_4_ * fVar69;
  fVar184 = auVar4._12_4_ * fVar69;
  auVar246._0_4_ = auVar5._0_4_ * fVar94;
  auVar246._4_4_ = auVar5._4_4_ * fVar94;
  auVar246._8_4_ = auVar5._8_4_ * fVar94;
  auVar246._12_4_ = auVar5._12_4_ * fVar94;
  fVar94 = auVar16._0_4_;
  auVar204._0_4_ = auVar4._0_4_ * fVar94;
  auVar204._4_4_ = auVar4._4_4_ * fVar94;
  auVar204._8_4_ = auVar4._8_4_ * fVar94;
  auVar204._12_4_ = auVar4._12_4_ * fVar94;
  auVar4 = vsubps_avx(auVar246,auVar204);
  auVar16 = vrcpss_avx(auVar231,auVar231);
  auVar113 = vfnmadd213ss_fma(auVar113,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar72 = auVar16._0_4_ * auVar113._0_4_;
  auVar113 = vdpps_avx(auVar6,auVar6,0x7f);
  fVar98 = auVar113._0_4_;
  auVar231 = ZEXT416((uint)fVar98);
  auVar16 = vrsqrtss_avx(auVar231,auVar231);
  fVar94 = auVar16._0_4_;
  fVar94 = fVar94 * 1.5 + fVar98 * -0.5 * fVar94 * fVar94 * fVar94;
  auVar16 = vdpps_avx(auVar6,auVar7,0x7f);
  fVar262 = fVar94 * auVar6._0_4_;
  fVar274 = fVar94 * auVar6._4_4_;
  fVar275 = fVar94 * auVar6._8_4_;
  fVar276 = fVar94 * auVar6._12_4_;
  auVar185._0_4_ = fVar98 * auVar7._0_4_;
  auVar185._4_4_ = fVar98 * auVar7._4_4_;
  auVar185._8_4_ = fVar98 * auVar7._8_4_;
  auVar185._12_4_ = fVar98 * auVar7._12_4_;
  fVar98 = auVar16._0_4_;
  auVar155._0_4_ = fVar98 * auVar6._0_4_;
  auVar155._4_4_ = fVar98 * auVar6._4_4_;
  auVar155._8_4_ = fVar98 * auVar6._8_4_;
  auVar155._12_4_ = fVar98 * auVar6._12_4_;
  auVar5 = vsubps_avx(auVar185,auVar155);
  auVar16 = vrcpss_avx(auVar231,auVar231);
  auVar113 = vfnmadd213ss_fma(auVar113,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar98 = auVar113._0_4_ * auVar16._0_4_;
  auVar113 = vshufps_avx(auVar9,auVar9,0xff);
  auVar215._0_4_ = auVar113._0_4_ * fVar168;
  auVar215._4_4_ = auVar113._4_4_ * fVar182;
  auVar215._8_4_ = auVar113._8_4_ * fVar183;
  auVar215._12_4_ = auVar113._12_4_ * fVar184;
  auVar231 = vsubps_avx(auVar9,auVar215);
  auVar16 = vshufps_avx(auVar74,auVar74,0xff);
  auVar171._0_4_ = auVar16._0_4_ * fVar168 + fVar69 * auVar4._0_4_ * fVar72 * auVar113._0_4_;
  auVar171._4_4_ = auVar16._4_4_ * fVar182 + fVar69 * auVar4._4_4_ * fVar72 * auVar113._4_4_;
  auVar171._8_4_ = auVar16._8_4_ * fVar183 + fVar69 * auVar4._8_4_ * fVar72 * auVar113._8_4_;
  auVar171._12_4_ = auVar16._12_4_ * fVar184 + fVar69 * auVar4._12_4_ * fVar72 * auVar113._12_4_;
  auVar4 = vsubps_avx(auVar74,auVar171);
  auVar232._0_4_ = auVar215._0_4_ + auVar9._0_4_;
  auVar232._4_4_ = auVar215._4_4_ + auVar9._4_4_;
  auVar232._8_4_ = auVar215._8_4_ + auVar9._8_4_;
  auVar232._12_4_ = auVar215._12_4_ + auVar9._12_4_;
  auVar113 = vshufps_avx(auVar73,auVar73,0xff);
  auVar121._0_4_ = fVar262 * auVar113._0_4_;
  auVar121._4_4_ = fVar274 * auVar113._4_4_;
  auVar121._8_4_ = fVar275 * auVar113._8_4_;
  auVar121._12_4_ = fVar276 * auVar113._12_4_;
  auVar9 = vsubps_avx(auVar73,auVar121);
  auVar16 = vshufps_avx(auVar153,auVar153,0xff);
  auVar101._0_4_ = fVar262 * auVar16._0_4_ + auVar113._0_4_ * fVar94 * auVar5._0_4_ * fVar98;
  auVar101._4_4_ = fVar274 * auVar16._4_4_ + auVar113._4_4_ * fVar94 * auVar5._4_4_ * fVar98;
  auVar101._8_4_ = fVar275 * auVar16._8_4_ + auVar113._8_4_ * fVar94 * auVar5._8_4_ * fVar98;
  auVar101._12_4_ = fVar276 * auVar16._12_4_ + auVar113._12_4_ * fVar94 * auVar5._12_4_ * fVar98;
  auVar113 = vsubps_avx(auVar153,auVar101);
  fVar168 = auVar73._0_4_ + auVar121._0_4_;
  fVar182 = auVar73._4_4_ + auVar121._4_4_;
  fVar183 = auVar73._8_4_ + auVar121._8_4_;
  fVar184 = auVar73._12_4_ + auVar121._12_4_;
  auVar134._0_4_ = auVar231._0_4_ + auVar4._0_4_ * 0.33333334;
  auVar134._4_4_ = auVar231._4_4_ + auVar4._4_4_ * 0.33333334;
  auVar134._8_4_ = auVar231._8_4_ + auVar4._8_4_ * 0.33333334;
  auVar134._12_4_ = auVar231._12_4_ + auVar4._12_4_ * 0.33333334;
  auVar102._0_4_ = auVar113._0_4_ * 0.33333334;
  auVar102._4_4_ = auVar113._4_4_ * 0.33333334;
  auVar102._8_4_ = auVar113._8_4_ * 0.33333334;
  auVar102._12_4_ = auVar113._12_4_ * 0.33333334;
  auVar73 = vsubps_avx(auVar9,auVar102);
  auVar153 = vsubps_avx(auVar231,auVar8);
  auVar113 = vshufps_avx(auVar153,auVar153,0x55);
  auVar16 = vshufps_avx(auVar153,auVar153,0xaa);
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar69 = pre->ray_space[k].vz.field_0.m128[0];
  fVar94 = pre->ray_space[k].vz.field_0.m128[1];
  fVar72 = pre->ray_space[k].vz.field_0.m128[2];
  fVar98 = pre->ray_space[k].vz.field_0.m128[3];
  auVar103._0_4_ = fVar69 * auVar16._0_4_;
  auVar103._4_4_ = fVar94 * auVar16._4_4_;
  auVar103._8_4_ = fVar72 * auVar16._8_4_;
  auVar103._12_4_ = fVar98 * auVar16._12_4_;
  auVar4 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar3,auVar113);
  auVar74 = vsubps_avx(auVar134,auVar8);
  auVar113 = vshufps_avx(auVar74,auVar74,0x55);
  auVar16 = vshufps_avx(auVar74,auVar74,0xaa);
  auVar286._0_4_ = fVar69 * auVar16._0_4_;
  auVar286._4_4_ = fVar94 * auVar16._4_4_;
  auVar286._8_4_ = fVar72 * auVar16._8_4_;
  auVar286._12_4_ = fVar98 * auVar16._12_4_;
  auVar16 = vfmadd231ps_fma(auVar286,(undefined1  [16])aVar3,auVar113);
  auVar102 = vsubps_avx(auVar73,auVar8);
  auVar113 = vshufps_avx(auVar102,auVar102,0xaa);
  auVar252._0_4_ = fVar69 * auVar113._0_4_;
  auVar252._4_4_ = fVar94 * auVar113._4_4_;
  auVar252._8_4_ = fVar72 * auVar113._8_4_;
  auVar252._12_4_ = fVar98 * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar102,auVar102,0x55);
  auVar5 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar3,auVar113);
  auVar100 = vsubps_avx(auVar9,auVar8);
  auVar113 = vshufps_avx(auVar100,auVar100,0xaa);
  auVar264._0_4_ = fVar69 * auVar113._0_4_;
  auVar264._4_4_ = fVar94 * auVar113._4_4_;
  auVar264._8_4_ = fVar72 * auVar113._8_4_;
  auVar264._12_4_ = fVar98 * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar100,auVar100,0x55);
  auVar6 = vfmadd231ps_fma(auVar264,(undefined1  [16])aVar3,auVar113);
  auVar103 = vsubps_avx(auVar232,auVar8);
  auVar113 = vshufps_avx(auVar103,auVar103,0xaa);
  auVar156._0_4_ = fVar69 * auVar113._0_4_;
  auVar156._4_4_ = fVar94 * auVar113._4_4_;
  auVar156._8_4_ = fVar72 * auVar113._8_4_;
  auVar156._12_4_ = fVar98 * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar103,auVar103,0x55);
  auVar7 = vfmadd231ps_fma(auVar156,(undefined1  [16])aVar3,auVar113);
  auVar75._0_4_ = (fVar131 + auVar171._0_4_) * 0.33333334 + auVar232._0_4_;
  auVar75._4_4_ = (fVar95 + auVar171._4_4_) * 0.33333334 + auVar232._4_4_;
  auVar75._8_4_ = (fVar96 + auVar171._8_4_) * 0.33333334 + auVar232._8_4_;
  auVar75._12_4_ = (fVar71 + auVar171._12_4_) * 0.33333334 + auVar232._12_4_;
  auVar120 = vsubps_avx(auVar75,auVar8);
  auVar113 = vshufps_avx(auVar120,auVar120,0xaa);
  auVar205._0_4_ = auVar113._0_4_ * fVar69;
  auVar205._4_4_ = auVar113._4_4_ * fVar94;
  auVar205._8_4_ = auVar113._8_4_ * fVar72;
  auVar205._12_4_ = auVar113._12_4_ * fVar98;
  auVar113 = vshufps_avx(auVar120,auVar120,0x55);
  auVar77 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar3,auVar113);
  auVar216._0_4_ = (fVar70 + auVar101._0_4_) * 0.33333334;
  auVar216._4_4_ = (fVar229 + auVar101._4_4_) * 0.33333334;
  auVar216._8_4_ = (fVar143 + auVar101._8_4_) * 0.33333334;
  auVar216._12_4_ = (fVar152 + auVar101._12_4_) * 0.33333334;
  auVar17._4_4_ = fVar182;
  auVar17._0_4_ = fVar168;
  auVar17._8_4_ = fVar183;
  auVar17._12_4_ = fVar184;
  auVar101 = vsubps_avx(auVar17,auVar216);
  auVar121 = vsubps_avx(auVar101,auVar8);
  auVar113 = vshufps_avx(auVar121,auVar121,0xaa);
  auVar217._0_4_ = auVar113._0_4_ * fVar69;
  auVar217._4_4_ = auVar113._4_4_ * fVar94;
  auVar217._8_4_ = auVar113._8_4_ * fVar72;
  auVar217._12_4_ = auVar113._12_4_ * fVar98;
  auVar113 = vshufps_avx(auVar121,auVar121,0x55);
  auVar132 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar3,auVar113);
  auVar17 = vsubps_avx(auVar17,auVar8);
  auVar113 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar76._0_4_ = fVar69 * auVar113._0_4_;
  auVar76._4_4_ = fVar94 * auVar113._4_4_;
  auVar76._8_4_ = fVar72 * auVar113._8_4_;
  auVar76._12_4_ = fVar98 * auVar113._12_4_;
  auVar113 = vshufps_avx(auVar17,auVar17,0x55);
  auVar113 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar113);
  local_418 = auVar153._0_4_;
  auVar172._4_4_ = local_418;
  auVar172._0_4_ = local_418;
  auVar172._8_4_ = local_418;
  auVar172._12_4_ = local_418;
  aVar3 = pre->ray_space[k].vx.field_0;
  auVar76 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar3,auVar172);
  local_428 = auVar74._0_4_;
  auVar173._4_4_ = local_428;
  auVar173._0_4_ = local_428;
  auVar173._8_4_ = local_428;
  auVar173._12_4_ = local_428;
  auVar133 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar3,auVar173);
  uVar65 = auVar102._0_4_;
  auVar254._4_4_ = uVar65;
  auVar254._0_4_ = uVar65;
  auVar254._8_4_ = uVar65;
  auVar254._12_4_ = uVar65;
  auVar144 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar3,auVar254);
  uVar65 = auVar100._0_4_;
  auVar159._4_4_ = uVar65;
  auVar159._0_4_ = uVar65;
  auVar159._8_4_ = uVar65;
  auVar159._12_4_ = uVar65;
  auVar26 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar3,auVar159);
  uVar65 = auVar103._0_4_;
  auVar174._4_4_ = uVar65;
  auVar174._0_4_ = uVar65;
  auVar174._8_4_ = uVar65;
  auVar174._12_4_ = uVar65;
  auVar154 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar3,auVar174);
  uVar65 = auVar120._0_4_;
  auVar247._4_4_ = uVar65;
  auVar247._0_4_ = uVar65;
  auVar247._8_4_ = uVar65;
  auVar247._12_4_ = uVar65;
  auVar155 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar247);
  uVar65 = auVar121._0_4_;
  auVar175._4_4_ = uVar65;
  auVar175._0_4_ = uVar65;
  auVar175._8_4_ = uVar65;
  auVar175._12_4_ = uVar65;
  auVar156 = vfmadd231ps_fma(auVar132,(undefined1  [16])aVar3,auVar175);
  uVar65 = auVar17._0_4_;
  auVar176._4_4_ = uVar65;
  auVar176._0_4_ = uVar65;
  auVar176._8_4_ = uVar65;
  auVar176._12_4_ = uVar65;
  auVar169 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar3,auVar176);
  auVar5 = vmovlhps_avx(auVar76,auVar154);
  auVar6 = vmovlhps_avx(auVar133,auVar155);
  auVar7 = vmovlhps_avx(auVar144,auVar156);
  auVar8 = vmovlhps_avx(auVar26,auVar169);
  auVar113 = vminps_avx(auVar5,auVar6);
  auVar16 = vminps_avx(auVar7,auVar8);
  auVar4 = vminps_avx(auVar113,auVar16);
  auVar113 = vmaxps_avx(auVar5,auVar6);
  auVar16 = vmaxps_avx(auVar7,auVar8);
  auVar113 = vmaxps_avx(auVar113,auVar16);
  auVar16 = vshufpd_avx(auVar4,auVar4,3);
  auVar4 = vminps_avx(auVar4,auVar16);
  auVar16 = vshufpd_avx(auVar113,auVar113,3);
  auVar16 = vmaxps_avx(auVar113,auVar16);
  auVar233._8_4_ = 0x7fffffff;
  auVar233._0_8_ = 0x7fffffff7fffffff;
  auVar233._12_4_ = 0x7fffffff;
  auVar113 = vandps_avx(auVar233,auVar4);
  auVar16 = vandps_avx(auVar233,auVar16);
  auVar113 = vmaxps_avx(auVar113,auVar16);
  auVar16 = vmovshdup_avx(auVar113);
  auVar113 = vmaxss_avx(auVar16,auVar113);
  fVar94 = auVar113._0_4_ * 9.536743e-07;
  auVar186._8_8_ = auVar76._0_8_;
  auVar186._0_8_ = auVar76._0_8_;
  auVar234._8_8_ = auVar133._0_8_;
  auVar234._0_8_ = auVar133._0_8_;
  auVar253._0_8_ = auVar144._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  auVar265._0_8_ = auVar26._0_8_;
  auVar265._8_8_ = auVar265._0_8_;
  local_78 = fVar94;
  fStack_74 = fVar94;
  fStack_70 = fVar94;
  fStack_6c = fVar94;
  fStack_68 = fVar94;
  fStack_64 = fVar94;
  fStack_60 = fVar94;
  fStack_5c = fVar94;
  fStack_90 = -fVar94;
  local_98 = -fVar94;
  fStack_94 = -fVar94;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar68 = 0;
  fVar69 = *(float *)(ray + k * 4 + 0x30);
  auVar16 = vsubps_avx(auVar6,auVar5);
  auVar4 = vsubps_avx(auVar7,auVar6);
  auVar132 = vsubps_avx(auVar8,auVar7);
  auVar76 = vsubps_avx(auVar232,auVar231);
  auVar133 = vsubps_avx(auVar75,auVar134);
  auVar144 = vsubps_avx(auVar101,auVar73);
  auVar26._4_4_ = fVar182;
  auVar26._0_4_ = fVar168;
  auVar26._8_4_ = fVar183;
  auVar26._12_4_ = fVar184;
  auVar26 = vsubps_avx(auVar26,auVar9);
  auVar77 = ZEXT816(0x3f80000000000000);
  auVar113 = auVar77;
LAB_0135ae99:
  auVar170 = vshufps_avx(auVar77,auVar77,0x50);
  auVar287._8_4_ = 0x3f800000;
  auVar287._0_8_ = 0x3f8000003f800000;
  auVar287._12_4_ = 0x3f800000;
  auVar292._16_4_ = 0x3f800000;
  auVar292._0_16_ = auVar287;
  auVar292._20_4_ = 0x3f800000;
  auVar292._24_4_ = 0x3f800000;
  auVar292._28_4_ = 0x3f800000;
  auVar171 = vsubps_avx(auVar287,auVar170);
  fVar72 = auVar170._0_4_;
  fVar143 = auVar154._0_4_;
  auVar78._0_4_ = fVar143 * fVar72;
  fVar98 = auVar170._4_4_;
  fVar152 = auVar154._4_4_;
  auVar78._4_4_ = fVar152 * fVar98;
  fVar131 = auVar170._8_4_;
  auVar78._8_4_ = fVar143 * fVar131;
  fVar95 = auVar170._12_4_;
  auVar78._12_4_ = fVar152 * fVar95;
  fVar262 = auVar155._0_4_;
  auVar177._0_4_ = fVar262 * fVar72;
  fVar274 = auVar155._4_4_;
  auVar177._4_4_ = fVar274 * fVar98;
  auVar177._8_4_ = fVar262 * fVar131;
  auVar177._12_4_ = fVar274 * fVar95;
  fVar202 = auVar156._0_4_;
  auVar145._0_4_ = fVar202 * fVar72;
  fVar212 = auVar156._4_4_;
  auVar145._4_4_ = fVar212 * fVar98;
  auVar145._8_4_ = fVar202 * fVar131;
  auVar145._12_4_ = fVar212 * fVar95;
  fVar213 = auVar169._0_4_;
  auVar122._0_4_ = fVar213 * fVar72;
  fVar228 = auVar169._4_4_;
  auVar122._4_4_ = fVar228 * fVar98;
  auVar122._8_4_ = fVar213 * fVar131;
  auVar122._12_4_ = fVar228 * fVar95;
  auVar254 = vfmadd231ps_fma(auVar78,auVar171,auVar186);
  auVar159 = vfmadd231ps_fma(auVar177,auVar171,auVar234);
  auVar174 = vfmadd231ps_fma(auVar145,auVar171,auVar253);
  auVar247 = vfmadd231ps_fma(auVar122,auVar265,auVar171);
  auVar170 = vmovshdup_avx(auVar113);
  fVar72 = auVar113._0_4_;
  fStack_140 = (auVar170._0_4_ - fVar72) * 0.04761905;
  auVar226._4_4_ = fVar72;
  auVar226._0_4_ = fVar72;
  auVar226._8_4_ = fVar72;
  auVar226._12_4_ = fVar72;
  auVar226._16_4_ = fVar72;
  auVar226._20_4_ = fVar72;
  auVar226._24_4_ = fVar72;
  auVar226._28_4_ = fVar72;
  auVar115._0_8_ = auVar170._0_8_;
  auVar115._8_8_ = auVar115._0_8_;
  auVar115._16_8_ = auVar115._0_8_;
  auVar115._24_8_ = auVar115._0_8_;
  auVar90 = vsubps_avx(auVar115,auVar226);
  uVar65 = auVar254._0_4_;
  auVar283._4_4_ = uVar65;
  auVar283._0_4_ = uVar65;
  auVar283._8_4_ = uVar65;
  auVar283._12_4_ = uVar65;
  auVar283._16_4_ = uVar65;
  auVar283._20_4_ = uVar65;
  auVar283._24_4_ = uVar65;
  auVar283._28_4_ = uVar65;
  auVar170 = vmovshdup_avx(auVar254);
  uVar99 = auVar170._0_8_;
  auVar273._8_8_ = uVar99;
  auVar273._0_8_ = uVar99;
  auVar273._16_8_ = uVar99;
  auVar273._24_8_ = uVar99;
  fVar275 = auVar159._0_4_;
  auVar259._4_4_ = fVar275;
  auVar259._0_4_ = fVar275;
  auVar259._8_4_ = fVar275;
  auVar259._12_4_ = fVar275;
  auVar259._16_4_ = fVar275;
  auVar259._20_4_ = fVar275;
  auVar259._24_4_ = fVar275;
  auVar259._28_4_ = fVar275;
  auVar171 = vmovshdup_avx(auVar159);
  auVar116._0_8_ = auVar171._0_8_;
  auVar116._8_8_ = auVar116._0_8_;
  auVar116._16_8_ = auVar116._0_8_;
  auVar116._24_8_ = auVar116._0_8_;
  fVar229 = auVar174._0_4_;
  auVar194._4_4_ = fVar229;
  auVar194._0_4_ = fVar229;
  auVar194._8_4_ = fVar229;
  auVar194._12_4_ = fVar229;
  auVar194._16_4_ = fVar229;
  auVar194._20_4_ = fVar229;
  auVar194._24_4_ = fVar229;
  auVar194._28_4_ = fVar229;
  auVar172 = vmovshdup_avx(auVar174);
  auVar210._0_8_ = auVar172._0_8_;
  auVar210._8_8_ = auVar210._0_8_;
  auVar210._16_8_ = auVar210._0_8_;
  auVar210._24_8_ = auVar210._0_8_;
  fVar70 = auVar247._0_4_;
  auVar173 = vmovshdup_avx(auVar247);
  auVar175 = vfmadd132ps_fma(auVar90,auVar226,_DAT_01f7b040);
  auVar90 = vsubps_avx(auVar292,ZEXT1632(auVar175));
  fVar72 = auVar175._0_4_;
  fVar98 = auVar175._4_4_;
  auVar28._4_4_ = fVar275 * fVar98;
  auVar28._0_4_ = fVar275 * fVar72;
  fVar131 = auVar175._8_4_;
  auVar28._8_4_ = fVar275 * fVar131;
  fVar95 = auVar175._12_4_;
  auVar28._12_4_ = fVar275 * fVar95;
  auVar28._16_4_ = fVar275 * 0.0;
  auVar28._20_4_ = fVar275 * 0.0;
  auVar28._24_4_ = fVar275 * 0.0;
  auVar28._28_4_ = 0x3f800000;
  auVar175 = vfmadd231ps_fma(auVar28,auVar90,auVar283);
  fVar96 = auVar171._0_4_;
  fVar71 = auVar171._4_4_;
  auVar29._4_4_ = fVar71 * fVar98;
  auVar29._0_4_ = fVar96 * fVar72;
  auVar29._8_4_ = fVar96 * fVar131;
  auVar29._12_4_ = fVar71 * fVar95;
  auVar29._16_4_ = fVar96 * 0.0;
  auVar29._20_4_ = fVar71 * 0.0;
  auVar29._24_4_ = fVar96 * 0.0;
  auVar29._28_4_ = uVar65;
  auVar176 = vfmadd231ps_fma(auVar29,auVar90,auVar273);
  auVar30._4_4_ = fVar229 * fVar98;
  auVar30._0_4_ = fVar229 * fVar72;
  auVar30._8_4_ = fVar229 * fVar131;
  auVar30._12_4_ = fVar229 * fVar95;
  auVar30._16_4_ = fVar229 * 0.0;
  auVar30._20_4_ = fVar229 * 0.0;
  auVar30._24_4_ = fVar229 * 0.0;
  auVar30._28_4_ = auVar170._4_4_;
  auVar136 = vfmadd231ps_fma(auVar30,auVar90,auVar259);
  fVar96 = auVar172._0_4_;
  fVar71 = auVar172._4_4_;
  auVar31._4_4_ = fVar71 * fVar98;
  auVar31._0_4_ = fVar96 * fVar72;
  auVar31._8_4_ = fVar96 * fVar131;
  auVar31._12_4_ = fVar71 * fVar95;
  auVar31._16_4_ = fVar96 * 0.0;
  auVar31._20_4_ = fVar71 * 0.0;
  auVar31._24_4_ = fVar96 * 0.0;
  auVar31._28_4_ = fVar275;
  auVar185 = vfmadd231ps_fma(auVar31,auVar90,auVar116);
  auVar170 = vshufps_avx(auVar254,auVar254,0xaa);
  local_568._8_8_ = auVar170._0_8_;
  local_568._0_8_ = local_568._8_8_;
  local_568._16_8_ = local_568._8_8_;
  local_568._24_8_ = local_568._8_8_;
  auVar171 = vshufps_avx(auVar254,auVar254,0xff);
  uStack_610 = auVar171._0_8_;
  local_618 = (undefined1  [8])uStack_610;
  uStack_608 = uStack_610;
  uStack_600 = uStack_610;
  auVar32._4_4_ = fVar70 * fVar98;
  auVar32._0_4_ = fVar70 * fVar72;
  auVar32._8_4_ = fVar70 * fVar131;
  auVar32._12_4_ = fVar70 * fVar95;
  auVar32._16_4_ = fVar70 * 0.0;
  auVar32._20_4_ = fVar70 * 0.0;
  auVar32._24_4_ = fVar70 * 0.0;
  auVar32._28_4_ = fVar70;
  auVar254 = vfmadd231ps_fma(auVar32,auVar90,auVar194);
  auVar171 = vshufps_avx(auVar159,auVar159,0xaa);
  auVar195._0_8_ = auVar171._0_8_;
  auVar195._8_8_ = auVar195._0_8_;
  auVar195._16_8_ = auVar195._0_8_;
  auVar195._24_8_ = auVar195._0_8_;
  auVar172 = vshufps_avx(auVar159,auVar159,0xff);
  local_4e8._8_8_ = auVar172._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar96 = auVar173._0_4_;
  fVar71 = auVar173._4_4_;
  auVar33._4_4_ = fVar71 * fVar98;
  auVar33._0_4_ = fVar96 * fVar72;
  auVar33._8_4_ = fVar96 * fVar131;
  auVar33._12_4_ = fVar71 * fVar95;
  auVar33._16_4_ = fVar96 * 0.0;
  auVar33._20_4_ = fVar71 * 0.0;
  auVar33._24_4_ = fVar96 * 0.0;
  auVar33._28_4_ = auVar170._4_4_;
  auVar203 = vfmadd231ps_fma(auVar33,auVar90,auVar210);
  auVar34._28_4_ = fVar71;
  auVar34._0_28_ =
       ZEXT1628(CONCAT412(auVar136._12_4_ * fVar95,
                          CONCAT48(auVar136._8_4_ * fVar131,
                                   CONCAT44(auVar136._4_4_ * fVar98,auVar136._0_4_ * fVar72))));
  auVar175 = vfmadd231ps_fma(auVar34,auVar90,ZEXT1632(auVar175));
  fVar96 = auVar172._4_4_;
  auVar35._28_4_ = fVar96;
  auVar35._0_28_ =
       ZEXT1628(CONCAT412(auVar185._12_4_ * fVar95,
                          CONCAT48(auVar185._8_4_ * fVar131,
                                   CONCAT44(auVar185._4_4_ * fVar98,auVar185._0_4_ * fVar72))));
  auVar176 = vfmadd231ps_fma(auVar35,auVar90,ZEXT1632(auVar176));
  auVar170 = vshufps_avx(auVar174,auVar174,0xaa);
  uVar99 = auVar170._0_8_;
  auVar181._8_8_ = uVar99;
  auVar181._0_8_ = uVar99;
  auVar181._16_8_ = uVar99;
  auVar181._24_8_ = uVar99;
  auVar173 = vshufps_avx(auVar174,auVar174,0xff);
  uVar99 = auVar173._0_8_;
  auVar293._8_8_ = uVar99;
  auVar293._0_8_ = uVar99;
  auVar293._16_8_ = uVar99;
  auVar293._24_8_ = uVar99;
  auVar174 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar254._12_4_ * fVar95,
                                                CONCAT48(auVar254._8_4_ * fVar131,
                                                         CONCAT44(auVar254._4_4_ * fVar98,
                                                                  auVar254._0_4_ * fVar72)))),
                             auVar90,ZEXT1632(auVar136));
  auVar254 = vshufps_avx(auVar247,auVar247,0xaa);
  auVar159 = vshufps_avx(auVar247,auVar247,0xff);
  auVar247 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar203._12_4_,
                                                CONCAT48(fVar131 * auVar203._8_4_,
                                                         CONCAT44(fVar98 * auVar203._4_4_,
                                                                  fVar72 * auVar203._0_4_)))),
                             auVar90,ZEXT1632(auVar185));
  auVar136 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar174._12_4_,
                                                CONCAT48(fVar131 * auVar174._8_4_,
                                                         CONCAT44(fVar98 * auVar174._4_4_,
                                                                  fVar72 * auVar174._0_4_)))),
                             auVar90,ZEXT1632(auVar175));
  auVar18 = vsubps_avx(ZEXT1632(auVar174),ZEXT1632(auVar175));
  auVar174 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar247._12_4_,
                                                CONCAT48(fVar131 * auVar247._8_4_,
                                                         CONCAT44(fVar98 * auVar247._4_4_,
                                                                  fVar72 * auVar247._0_4_)))),
                             auVar90,ZEXT1632(auVar176));
  auVar19 = vsubps_avx(ZEXT1632(auVar247),ZEXT1632(auVar176));
  fStack_3ec = auVar19._28_4_;
  auVar260._0_4_ = fStack_140 * auVar18._0_4_ * 3.0;
  auVar260._4_4_ = fStack_140 * auVar18._4_4_ * 3.0;
  auVar260._8_4_ = fStack_140 * auVar18._8_4_ * 3.0;
  auVar260._12_4_ = fStack_140 * auVar18._12_4_ * 3.0;
  auVar260._16_4_ = fStack_140 * auVar18._16_4_ * 3.0;
  auVar260._20_4_ = fStack_140 * auVar18._20_4_ * 3.0;
  auVar260._24_4_ = fStack_140 * auVar18._24_4_ * 3.0;
  auVar260._28_4_ = 0;
  local_408._0_4_ = fStack_140 * auVar19._0_4_ * 3.0;
  local_408._4_4_ = fStack_140 * auVar19._4_4_ * 3.0;
  fStack_400 = fStack_140 * auVar19._8_4_ * 3.0;
  fStack_3fc = fStack_140 * auVar19._12_4_ * 3.0;
  fStack_3f8 = fStack_140 * auVar19._16_4_ * 3.0;
  fStack_3f4 = fStack_140 * auVar19._20_4_ * 3.0;
  fStack_3f0 = fStack_140 * auVar19._24_4_ * 3.0;
  fVar71 = auVar171._0_4_;
  fVar70 = auVar171._4_4_;
  auVar36._4_4_ = fVar70 * fVar98;
  auVar36._0_4_ = fVar71 * fVar72;
  auVar36._8_4_ = fVar71 * fVar131;
  auVar36._12_4_ = fVar70 * fVar95;
  auVar36._16_4_ = fVar71 * 0.0;
  auVar36._20_4_ = fVar70 * 0.0;
  auVar36._24_4_ = fVar71 * 0.0;
  auVar36._28_4_ = fStack_3ec;
  auVar171 = vfmadd231ps_fma(auVar36,auVar90,local_568);
  fVar71 = auVar172._0_4_;
  auVar37._4_4_ = fVar96 * fVar98;
  auVar37._0_4_ = fVar71 * fVar72;
  auVar37._8_4_ = fVar71 * fVar131;
  auVar37._12_4_ = fVar96 * fVar95;
  auVar37._16_4_ = fVar71 * 0.0;
  auVar37._20_4_ = fVar96 * 0.0;
  auVar37._24_4_ = fVar71 * 0.0;
  auVar37._28_4_ = 0;
  auVar172 = vfmadd231ps_fma(auVar37,auVar90,_local_618);
  fVar96 = auVar170._0_4_;
  fVar71 = auVar170._4_4_;
  auVar38._4_4_ = fVar71 * fVar98;
  auVar38._0_4_ = fVar96 * fVar72;
  auVar38._8_4_ = fVar96 * fVar131;
  auVar38._12_4_ = fVar71 * fVar95;
  auVar38._16_4_ = fVar96 * 0.0;
  auVar38._20_4_ = fVar71 * 0.0;
  auVar38._24_4_ = fVar96 * 0.0;
  auVar38._28_4_ = auVar18._28_4_;
  auVar170 = vfmadd231ps_fma(auVar38,auVar90,auVar195);
  fVar96 = auVar173._0_4_;
  fVar229 = auVar173._4_4_;
  auVar39._4_4_ = fVar229 * fVar98;
  auVar39._0_4_ = fVar96 * fVar72;
  auVar39._8_4_ = fVar96 * fVar131;
  auVar39._12_4_ = fVar229 * fVar95;
  auVar39._16_4_ = fVar96 * 0.0;
  auVar39._20_4_ = fVar229 * 0.0;
  auVar39._24_4_ = fVar96 * 0.0;
  auVar39._28_4_ = fVar70;
  auVar173 = vfmadd231ps_fma(auVar39,auVar90,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar136));
  fVar96 = auVar254._0_4_;
  fVar71 = auVar254._4_4_;
  auVar40._4_4_ = fVar71 * fVar98;
  auVar40._0_4_ = fVar96 * fVar72;
  auVar40._8_4_ = fVar96 * fVar131;
  auVar40._12_4_ = fVar71 * fVar95;
  auVar40._16_4_ = fVar96 * 0.0;
  auVar40._20_4_ = fVar71 * 0.0;
  auVar40._24_4_ = fVar96 * 0.0;
  auVar40._28_4_ = fVar71;
  auVar254 = vfmadd231ps_fma(auVar40,auVar90,auVar181);
  auVar22 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar174));
  fVar96 = auVar159._0_4_;
  fVar71 = auVar159._4_4_;
  auVar41._4_4_ = fVar71 * fVar98;
  auVar41._0_4_ = fVar96 * fVar72;
  auVar41._8_4_ = fVar96 * fVar131;
  auVar41._12_4_ = fVar71 * fVar95;
  auVar41._16_4_ = fVar96 * 0.0;
  auVar41._20_4_ = fVar71 * 0.0;
  auVar41._24_4_ = fVar96 * 0.0;
  auVar41._28_4_ = fVar71;
  auVar159 = vfmadd231ps_fma(auVar41,auVar90,auVar293);
  auVar42._28_4_ = fVar229;
  auVar42._0_28_ =
       ZEXT1628(CONCAT412(auVar170._12_4_ * fVar95,
                          CONCAT48(auVar170._8_4_ * fVar131,
                                   CONCAT44(auVar170._4_4_ * fVar98,auVar170._0_4_ * fVar72))));
  auVar171 = vfmadd231ps_fma(auVar42,auVar90,ZEXT1632(auVar171));
  auVar172 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar173._12_4_,
                                                CONCAT48(fVar131 * auVar173._8_4_,
                                                         CONCAT44(fVar98 * auVar173._4_4_,
                                                                  fVar72 * auVar173._0_4_)))),
                             auVar90,ZEXT1632(auVar172));
  auVar117._0_4_ = auVar136._0_4_ + auVar260._0_4_;
  auVar117._4_4_ = auVar136._4_4_ + auVar260._4_4_;
  auVar117._8_4_ = auVar136._8_4_ + auVar260._8_4_;
  auVar117._12_4_ = auVar136._12_4_ + auVar260._12_4_;
  auVar117._16_4_ = auVar260._16_4_ + 0.0;
  auVar117._20_4_ = auVar260._20_4_ + 0.0;
  auVar117._24_4_ = auVar260._24_4_ + 0.0;
  auVar117._28_4_ = 0;
  auVar170 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar254._12_4_ * fVar95,
                                                CONCAT48(auVar254._8_4_ * fVar131,
                                                         CONCAT44(auVar254._4_4_ * fVar98,
                                                                  auVar254._0_4_ * fVar72)))),
                             auVar90,ZEXT1632(auVar170));
  auVar173 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar159._12_4_ * fVar95,
                                                CONCAT48(auVar159._8_4_ * fVar131,
                                                         CONCAT44(auVar159._4_4_ * fVar98,
                                                                  auVar159._0_4_ * fVar72)))),
                             auVar90,ZEXT1632(auVar173));
  auVar254 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar95 * auVar170._12_4_,
                                                CONCAT48(fVar131 * auVar170._8_4_,
                                                         CONCAT44(fVar98 * auVar170._4_4_,
                                                                  fVar72 * auVar170._0_4_)))),
                             auVar90,ZEXT1632(auVar171));
  auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar173._12_4_ * fVar95,
                                                CONCAT48(auVar173._8_4_ * fVar131,
                                                         CONCAT44(auVar173._4_4_ * fVar98,
                                                                  auVar173._0_4_ * fVar72)))),
                             ZEXT1632(auVar172),auVar90);
  auVar90 = vsubps_avx(ZEXT1632(auVar170),ZEXT1632(auVar171));
  auVar18 = vsubps_avx(ZEXT1632(auVar173),ZEXT1632(auVar172));
  auVar284._0_4_ = fStack_140 * auVar90._0_4_ * 3.0;
  auVar284._4_4_ = fStack_140 * auVar90._4_4_ * 3.0;
  auVar284._8_4_ = fStack_140 * auVar90._8_4_ * 3.0;
  auVar284._12_4_ = fStack_140 * auVar90._12_4_ * 3.0;
  auVar284._16_4_ = fStack_140 * auVar90._16_4_ * 3.0;
  auVar284._20_4_ = fStack_140 * auVar90._20_4_ * 3.0;
  auVar284._24_4_ = fStack_140 * auVar90._24_4_ * 3.0;
  auVar284._28_4_ = 0;
  local_158 = fStack_140 * auVar18._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar18._4_4_ * 3.0;
  auVar43._4_4_ = fStack_154;
  auVar43._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar18._8_4_ * 3.0;
  auVar43._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar18._12_4_ * 3.0;
  auVar43._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar18._16_4_ * 3.0;
  auVar43._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar18._20_4_ * 3.0;
  auVar43._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar18._24_4_ * 3.0;
  auVar43._24_4_ = fStack_140;
  auVar43._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar254));
  auVar23 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar159));
  auVar90 = vsubps_avx(ZEXT1632(auVar254),ZEXT1632(auVar136));
  auVar18 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar174));
  auVar19 = vsubps_avx(_local_508,local_4e8);
  fVar275 = auVar90._0_4_ + auVar19._0_4_;
  fVar276 = auVar90._4_4_ + auVar19._4_4_;
  fVar197 = auVar90._8_4_ + auVar19._8_4_;
  fVar198 = auVar90._12_4_ + auVar19._12_4_;
  fVar199 = auVar90._16_4_ + auVar19._16_4_;
  fVar200 = auVar90._20_4_ + auVar19._20_4_;
  fVar201 = auVar90._24_4_ + auVar19._24_4_;
  auVar20 = vsubps_avx(auVar23,auVar22);
  auVar91._0_4_ = auVar18._0_4_ + auVar20._0_4_;
  auVar91._4_4_ = auVar18._4_4_ + auVar20._4_4_;
  auVar91._8_4_ = auVar18._8_4_ + auVar20._8_4_;
  auVar91._12_4_ = auVar18._12_4_ + auVar20._12_4_;
  auVar91._16_4_ = auVar18._16_4_ + auVar20._16_4_;
  auVar91._20_4_ = auVar18._20_4_ + auVar20._20_4_;
  auVar91._24_4_ = auVar18._24_4_ + auVar20._24_4_;
  auVar91._28_4_ = auVar18._28_4_ + auVar20._28_4_;
  local_f8 = ZEXT1632(auVar174);
  fVar72 = auVar174._0_4_;
  local_178 = (float)local_408._0_4_ + fVar72;
  fVar98 = auVar174._4_4_;
  fStack_174 = (float)local_408._4_4_ + fVar98;
  fVar131 = auVar174._8_4_;
  fStack_170 = fStack_400 + fVar131;
  fVar95 = auVar174._12_4_;
  fStack_16c = fStack_3fc + fVar95;
  fStack_168 = fStack_3f8 + 0.0;
  fStack_164 = fStack_3f4 + 0.0;
  fStack_160 = fStack_3f0 + 0.0;
  local_b8 = ZEXT1632(auVar136);
  auVar18 = vsubps_avx(local_b8,auVar260);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar18);
  auVar18 = vsubps_avx(local_f8,_local_408);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar18);
  local_118._0_4_ = auVar254._0_4_ + auVar284._0_4_;
  local_118._4_4_ = auVar254._4_4_ + auVar284._4_4_;
  local_118._8_4_ = auVar254._8_4_ + auVar284._8_4_;
  local_118._12_4_ = auVar254._12_4_ + auVar284._12_4_;
  local_118._16_4_ = auVar284._16_4_ + 0.0;
  local_118._20_4_ = auVar284._20_4_ + 0.0;
  local_118._24_4_ = auVar284._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar261 = ZEXT1632(auVar254);
  auVar18 = vsubps_avx(auVar261,auVar284);
  auVar24 = vpermps_avx2(_DAT_01fb7720,auVar18);
  fVar96 = auVar159._0_4_;
  local_158 = fVar96 + local_158;
  fVar71 = auVar159._4_4_;
  fStack_154 = fVar71 + fStack_154;
  fVar70 = auVar159._8_4_;
  fStack_150 = fVar70 + fStack_150;
  fVar229 = auVar159._12_4_;
  fStack_14c = fVar229 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar18 = vsubps_avx(ZEXT1632(auVar159),auVar43);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar18);
  auVar44._4_4_ = fVar98 * fVar276;
  auVar44._0_4_ = fVar72 * fVar275;
  auVar44._8_4_ = fVar131 * fVar197;
  auVar44._12_4_ = fVar95 * fVar198;
  auVar44._16_4_ = fVar199 * 0.0;
  auVar44._20_4_ = fVar200 * 0.0;
  auVar44._24_4_ = fVar201 * 0.0;
  auVar44._28_4_ = auVar18._28_4_;
  auVar170 = vfnmadd231ps_fma(auVar44,local_b8,auVar91);
  fStack_15c = fStack_3ec + 0.0;
  auVar45._4_4_ = fStack_174 * fVar276;
  auVar45._0_4_ = local_178 * fVar275;
  auVar45._8_4_ = fStack_170 * fVar197;
  auVar45._12_4_ = fStack_16c * fVar198;
  auVar45._16_4_ = fStack_168 * fVar199;
  auVar45._20_4_ = fStack_164 * fVar200;
  auVar45._24_4_ = fStack_160 * fVar201;
  auVar45._28_4_ = 0;
  auVar171 = vfnmadd231ps_fma(auVar45,auVar91,auVar117);
  auVar46._4_4_ = local_198._4_4_ * fVar276;
  auVar46._0_4_ = local_198._0_4_ * fVar275;
  auVar46._8_4_ = local_198._8_4_ * fVar197;
  auVar46._12_4_ = local_198._12_4_ * fVar198;
  auVar46._16_4_ = local_198._16_4_ * fVar199;
  auVar46._20_4_ = local_198._20_4_ * fVar200;
  auVar46._24_4_ = local_198._24_4_ * fVar201;
  auVar46._28_4_ = fStack_3ec + 0.0;
  auVar172 = vfnmadd231ps_fma(auVar46,local_d8,auVar91);
  local_618._0_4_ = auVar22._0_4_;
  local_618._4_4_ = auVar22._4_4_;
  uStack_610._0_4_ = auVar22._8_4_;
  uStack_610._4_4_ = auVar22._12_4_;
  uStack_608._0_4_ = auVar22._16_4_;
  uStack_608._4_4_ = auVar22._20_4_;
  uStack_600._0_4_ = auVar22._24_4_;
  uStack_600._4_4_ = auVar22._28_4_;
  auVar47._4_4_ = (float)local_618._4_4_ * fVar276;
  auVar47._0_4_ = (float)local_618._0_4_ * fVar275;
  auVar47._8_4_ = (float)uStack_610 * fVar197;
  auVar47._12_4_ = uStack_610._4_4_ * fVar198;
  auVar47._16_4_ = (float)uStack_608 * fVar199;
  auVar47._20_4_ = uStack_608._4_4_ * fVar200;
  auVar47._24_4_ = (float)uStack_600 * fVar201;
  auVar47._28_4_ = uStack_600._4_4_;
  auVar173 = vfnmadd231ps_fma(auVar47,local_4e8,auVar91);
  auVar211._0_4_ = fVar96 * fVar275;
  auVar211._4_4_ = fVar71 * fVar276;
  auVar211._8_4_ = fVar70 * fVar197;
  auVar211._12_4_ = fVar229 * fVar198;
  auVar211._16_4_ = fVar199 * 0.0;
  auVar211._20_4_ = fVar200 * 0.0;
  auVar211._24_4_ = fVar201 * 0.0;
  auVar211._28_4_ = 0;
  auVar254 = vfnmadd231ps_fma(auVar211,auVar261,auVar91);
  uStack_13c = 0x40400000;
  auVar48._4_4_ = fStack_154 * fVar276;
  auVar48._0_4_ = local_158 * fVar275;
  auVar48._8_4_ = fStack_150 * fVar197;
  auVar48._12_4_ = fStack_14c * fVar198;
  auVar48._16_4_ = fStack_148 * fVar199;
  auVar48._20_4_ = fStack_144 * fVar200;
  auVar48._24_4_ = fStack_140 * fVar201;
  auVar48._28_4_ = local_4e8._28_4_;
  auVar174 = vfnmadd231ps_fma(auVar48,local_118,auVar91);
  auVar49._4_4_ = local_138._4_4_ * fVar276;
  auVar49._0_4_ = local_138._0_4_ * fVar275;
  auVar49._8_4_ = local_138._8_4_ * fVar197;
  auVar49._12_4_ = local_138._12_4_ * fVar198;
  auVar49._16_4_ = local_138._16_4_ * fVar199;
  auVar49._20_4_ = local_138._20_4_ * fVar200;
  auVar49._24_4_ = local_138._24_4_ * fVar201;
  auVar49._28_4_ = local_138._28_4_;
  auVar247 = vfnmadd231ps_fma(auVar49,auVar24,auVar91);
  auVar50._4_4_ = auVar23._4_4_ * fVar276;
  auVar50._0_4_ = auVar23._0_4_ * fVar275;
  auVar50._8_4_ = auVar23._8_4_ * fVar197;
  auVar50._12_4_ = auVar23._12_4_ * fVar198;
  auVar50._16_4_ = auVar23._16_4_ * fVar199;
  auVar50._20_4_ = auVar23._20_4_ * fVar200;
  auVar50._24_4_ = auVar23._24_4_ * fVar201;
  auVar50._28_4_ = auVar90._28_4_ + auVar19._28_4_;
  auVar227 = ZEXT3264(_local_508);
  auVar175 = vfnmadd231ps_fma(auVar50,_local_508,auVar91);
  auVar18 = vminps_avx(ZEXT1632(auVar170),ZEXT1632(auVar171));
  auVar90 = vmaxps_avx(ZEXT1632(auVar170),ZEXT1632(auVar171));
  auVar19 = vminps_avx(ZEXT1632(auVar172),ZEXT1632(auVar173));
  auVar19 = vminps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(ZEXT1632(auVar172),ZEXT1632(auVar173));
  auVar90 = vmaxps_avx(auVar90,auVar18);
  auVar20 = vminps_avx(ZEXT1632(auVar254),ZEXT1632(auVar174));
  auVar18 = vmaxps_avx(ZEXT1632(auVar254),ZEXT1632(auVar174));
  auVar21 = vminps_avx(ZEXT1632(auVar247),ZEXT1632(auVar175));
  auVar20 = vminps_avx(auVar20,auVar21);
  auVar20 = vminps_avx(auVar19,auVar20);
  auVar19 = vmaxps_avx(ZEXT1632(auVar247),ZEXT1632(auVar175));
  auVar18 = vmaxps_avx(auVar18,auVar19);
  auVar18 = vmaxps_avx(auVar90,auVar18);
  auVar59._4_4_ = fStack_74;
  auVar59._0_4_ = local_78;
  auVar59._8_4_ = fStack_70;
  auVar59._12_4_ = fStack_6c;
  auVar59._16_4_ = fStack_68;
  auVar59._20_4_ = fStack_64;
  auVar59._24_4_ = fStack_60;
  auVar59._28_4_ = fStack_5c;
  auVar90 = vcmpps_avx(auVar20,auVar59,2);
  auVar58._4_4_ = fStack_94;
  auVar58._0_4_ = local_98;
  auVar58._8_4_ = fStack_90;
  auVar58._12_4_ = fStack_8c;
  auVar58._16_4_ = fStack_88;
  auVar58._20_4_ = fStack_84;
  auVar58._24_4_ = fStack_80;
  auVar58._28_4_ = fStack_7c;
  auVar18 = vcmpps_avx(auVar18,auVar58,5);
  auVar90 = vandps_avx(auVar18,auVar90);
  auVar18 = local_1b8 & auVar90;
  if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0x7f,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar18 >> 0xbf,0) != '\0') ||
      (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0') {
    auVar18 = vsubps_avx(local_4e8,local_b8);
    auVar19 = vsubps_avx(_local_508,auVar261);
    fVar276 = auVar18._0_4_ + auVar19._0_4_;
    fVar197 = auVar18._4_4_ + auVar19._4_4_;
    fVar198 = auVar18._8_4_ + auVar19._8_4_;
    fVar199 = auVar18._12_4_ + auVar19._12_4_;
    fVar200 = auVar18._16_4_ + auVar19._16_4_;
    fVar201 = auVar18._20_4_ + auVar19._20_4_;
    fVar97 = auVar18._24_4_ + auVar19._24_4_;
    auVar20 = vsubps_avx(auVar22,local_f8);
    auVar21 = vsubps_avx(auVar23,ZEXT1632(auVar159));
    auVar118._0_4_ = auVar20._0_4_ + auVar21._0_4_;
    auVar118._4_4_ = auVar20._4_4_ + auVar21._4_4_;
    auVar118._8_4_ = auVar20._8_4_ + auVar21._8_4_;
    auVar118._12_4_ = auVar20._12_4_ + auVar21._12_4_;
    auVar118._16_4_ = auVar20._16_4_ + auVar21._16_4_;
    auVar118._20_4_ = auVar20._20_4_ + auVar21._20_4_;
    auVar118._24_4_ = auVar20._24_4_ + auVar21._24_4_;
    fVar275 = auVar21._28_4_;
    auVar118._28_4_ = auVar20._28_4_ + fVar275;
    auVar51._4_4_ = fVar98 * fVar197;
    auVar51._0_4_ = fVar72 * fVar276;
    auVar51._8_4_ = fVar131 * fVar198;
    auVar51._12_4_ = fVar95 * fVar199;
    auVar51._16_4_ = fVar200 * 0.0;
    auVar51._20_4_ = fVar201 * 0.0;
    auVar51._24_4_ = fVar97 * 0.0;
    auVar51._28_4_ = auVar23._28_4_;
    auVar254 = vfnmadd231ps_fma(auVar51,auVar118,local_b8);
    auVar52._4_4_ = fVar197 * fStack_174;
    auVar52._0_4_ = fVar276 * local_178;
    auVar52._8_4_ = fVar198 * fStack_170;
    auVar52._12_4_ = fVar199 * fStack_16c;
    auVar52._16_4_ = fVar200 * fStack_168;
    auVar52._20_4_ = fVar201 * fStack_164;
    auVar52._24_4_ = fVar97 * fStack_160;
    auVar52._28_4_ = 0;
    auVar170 = vfnmadd213ps_fma(auVar117,auVar118,auVar52);
    auVar53._4_4_ = fVar197 * local_198._4_4_;
    auVar53._0_4_ = fVar276 * local_198._0_4_;
    auVar53._8_4_ = fVar198 * local_198._8_4_;
    auVar53._12_4_ = fVar199 * local_198._12_4_;
    auVar53._16_4_ = fVar200 * local_198._16_4_;
    auVar53._20_4_ = fVar201 * local_198._20_4_;
    auVar53._24_4_ = fVar97 * local_198._24_4_;
    auVar53._28_4_ = 0;
    auVar171 = vfnmadd213ps_fma(local_d8,auVar118,auVar53);
    auVar54._4_4_ = (float)local_618._4_4_ * fVar197;
    auVar54._0_4_ = (float)local_618._0_4_ * fVar276;
    auVar54._8_4_ = (float)uStack_610 * fVar198;
    auVar54._12_4_ = uStack_610._4_4_ * fVar199;
    auVar54._16_4_ = (float)uStack_608 * fVar200;
    auVar54._20_4_ = uStack_608._4_4_ * fVar201;
    auVar54._24_4_ = (float)uStack_600 * fVar97;
    auVar54._28_4_ = 0;
    auVar159 = vfnmadd231ps_fma(auVar54,auVar118,local_4e8);
    auVar141._0_4_ = fVar96 * fVar276;
    auVar141._4_4_ = fVar71 * fVar197;
    auVar141._8_4_ = fVar70 * fVar198;
    auVar141._12_4_ = fVar229 * fVar199;
    auVar141._16_4_ = fVar200 * 0.0;
    auVar141._20_4_ = fVar201 * 0.0;
    auVar141._24_4_ = fVar97 * 0.0;
    auVar141._28_4_ = 0;
    auVar174 = vfnmadd231ps_fma(auVar141,auVar118,auVar261);
    auVar55._4_4_ = fVar197 * fStack_154;
    auVar55._0_4_ = fVar276 * local_158;
    auVar55._8_4_ = fVar198 * fStack_150;
    auVar55._12_4_ = fVar199 * fStack_14c;
    auVar55._16_4_ = fVar200 * fStack_148;
    auVar55._20_4_ = fVar201 * fStack_144;
    auVar55._24_4_ = fVar97 * fStack_140;
    auVar55._28_4_ = fVar275;
    auVar172 = vfnmadd213ps_fma(local_118,auVar118,auVar55);
    auVar56._4_4_ = fVar197 * local_138._4_4_;
    auVar56._0_4_ = fVar276 * local_138._0_4_;
    auVar56._8_4_ = fVar198 * local_138._8_4_;
    auVar56._12_4_ = fVar199 * local_138._12_4_;
    auVar56._16_4_ = fVar200 * local_138._16_4_;
    auVar56._20_4_ = fVar201 * local_138._20_4_;
    auVar56._24_4_ = fVar97 * local_138._24_4_;
    auVar56._28_4_ = fVar275;
    auVar173 = vfnmadd213ps_fma(auVar24,auVar118,auVar56);
    auVar227 = ZEXT1664(auVar173);
    auVar57._4_4_ = fVar197 * auVar23._4_4_;
    auVar57._0_4_ = fVar276 * auVar23._0_4_;
    auVar57._8_4_ = fVar198 * auVar23._8_4_;
    auVar57._12_4_ = fVar199 * auVar23._12_4_;
    auVar57._16_4_ = fVar200 * auVar23._16_4_;
    auVar57._20_4_ = fVar201 * auVar23._20_4_;
    auVar57._24_4_ = fVar97 * auVar23._24_4_;
    auVar57._28_4_ = auVar18._28_4_ + auVar19._28_4_;
    auVar247 = vfnmadd231ps_fma(auVar57,auVar118,_local_508);
    auVar19 = vminps_avx(ZEXT1632(auVar254),ZEXT1632(auVar170));
    auVar18 = vmaxps_avx(ZEXT1632(auVar254),ZEXT1632(auVar170));
    auVar20 = vminps_avx(ZEXT1632(auVar171),ZEXT1632(auVar159));
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(ZEXT1632(auVar171),ZEXT1632(auVar159));
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar21 = vminps_avx(ZEXT1632(auVar174),ZEXT1632(auVar172));
    auVar19 = vmaxps_avx(ZEXT1632(auVar174),ZEXT1632(auVar172));
    auVar22 = vminps_avx(ZEXT1632(auVar173),ZEXT1632(auVar247));
    auVar21 = vminps_avx(auVar21,auVar22);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(ZEXT1632(auVar173),ZEXT1632(auVar247));
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vcmpps_avx(auVar21,auVar59,2);
    auVar19 = vcmpps_avx(auVar19,auVar58,5);
    auVar18 = vandps_avx(auVar19,auVar18);
    auVar90 = vandps_avx(auVar90,local_1b8);
    auVar19 = auVar90 & auVar18;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar90 = vandps_avx(auVar18,auVar90);
      uVar64 = vmovmskps_avx(auVar90);
      if (uVar64 != 0) {
        mask_stack[uVar68] = uVar64 & 0xff;
        BVar2 = (BBox1f)vmovlps_avx(auVar113);
        cu_stack[uVar68] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar77);
        cv_stack[uVar68] = BVar2;
        uVar68 = (ulong)((int)uVar68 + 1);
      }
    }
  }
LAB_0135b449:
  if ((int)uVar68 == 0) {
    uVar65 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar93._4_4_ = uVar65;
    auVar93._0_4_ = uVar65;
    auVar93._8_4_ = uVar65;
    auVar93._12_4_ = uVar65;
    auVar93._16_4_ = uVar65;
    auVar93._20_4_ = uVar65;
    auVar93._24_4_ = uVar65;
    auVar93._28_4_ = uVar65;
    auVar90 = vcmpps_avx(local_1d8,auVar93,2);
    uVar61 = vmovmskps_avx(auVar90);
    uVar66 = (ulong)((uint)uVar66 & uVar61);
    goto LAB_0135a6cb;
  }
  uVar60 = (int)uVar68 - 1;
  uVar64 = mask_stack[uVar60];
  fVar72 = cu_stack[uVar60].lower;
  fVar98 = cu_stack[uVar60].upper;
  iVar25 = 0;
  for (uVar67 = (ulong)uVar64; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    iVar25 = iVar25 + 1;
  }
  uVar64 = uVar64 - 1 & uVar64;
  if (uVar64 == 0) {
    uVar68 = (ulong)uVar60;
  }
  auVar77._8_8_ = 0;
  auVar77._0_4_ = cv_stack[uVar60].lower;
  auVar77._4_4_ = cv_stack[uVar60].upper;
  mask_stack[uVar60] = uVar64;
  fVar131 = (float)(iVar25 + 1) * 0.14285715;
  auVar113 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * (float)iVar25 * 0.14285715)),
                             ZEXT416((uint)fVar72),ZEXT416((uint)(1.0 - (float)iVar25 * 0.14285715))
                            );
  auVar170 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * fVar131)),ZEXT416((uint)fVar72),
                             ZEXT416((uint)(1.0 - fVar131)));
  fVar98 = auVar170._0_4_;
  auVar196._0_4_ = auVar113._0_4_;
  fVar72 = fVar98 - auVar196._0_4_;
  if (fVar72 < 0.16666667) {
    auVar171 = vshufps_avx(auVar77,auVar77,0x50);
    auVar104._8_4_ = 0x3f800000;
    auVar104._0_8_ = 0x3f8000003f800000;
    auVar104._12_4_ = 0x3f800000;
    auVar172 = vsubps_avx(auVar104,auVar171);
    fVar131 = auVar171._0_4_;
    auVar146._0_4_ = fVar131 * fVar143;
    fVar95 = auVar171._4_4_;
    auVar146._4_4_ = fVar95 * fVar152;
    fVar96 = auVar171._8_4_;
    auVar146._8_4_ = fVar96 * fVar143;
    fVar71 = auVar171._12_4_;
    auVar146._12_4_ = fVar71 * fVar152;
    auVar157._0_4_ = fVar131 * fVar262;
    auVar157._4_4_ = fVar95 * fVar274;
    auVar157._8_4_ = fVar96 * fVar262;
    auVar157._12_4_ = fVar71 * fVar274;
    auVar178._0_4_ = fVar131 * fVar202;
    auVar178._4_4_ = fVar95 * fVar212;
    auVar178._8_4_ = fVar96 * fVar202;
    auVar178._12_4_ = fVar71 * fVar212;
    auVar79._0_4_ = fVar131 * fVar213;
    auVar79._4_4_ = fVar95 * fVar228;
    auVar79._8_4_ = fVar96 * fVar213;
    auVar79._12_4_ = fVar71 * fVar228;
    auVar171 = vfmadd231ps_fma(auVar146,auVar172,auVar186);
    auVar173 = vfmadd231ps_fma(auVar157,auVar172,auVar234);
    auVar254 = vfmadd231ps_fma(auVar178,auVar172,auVar253);
    auVar172 = vfmadd231ps_fma(auVar79,auVar172,auVar265);
    auVar142._16_16_ = auVar171;
    auVar142._0_16_ = auVar171;
    auVar151._16_16_ = auVar173;
    auVar151._0_16_ = auVar173;
    auVar167._16_16_ = auVar254;
    auVar167._0_16_ = auVar254;
    auVar196._4_4_ = auVar196._0_4_;
    auVar196._8_4_ = auVar196._0_4_;
    auVar196._12_4_ = auVar196._0_4_;
    auVar196._20_4_ = fVar98;
    auVar196._16_4_ = fVar98;
    auVar196._24_4_ = fVar98;
    auVar196._28_4_ = fVar98;
    auVar90 = vsubps_avx(auVar151,auVar142);
    auVar173 = vfmadd213ps_fma(auVar90,auVar196,auVar142);
    auVar90 = vsubps_avx(auVar167,auVar151);
    auVar159 = vfmadd213ps_fma(auVar90,auVar196,auVar151);
    auVar171 = vsubps_avx(auVar172,auVar254);
    auVar92._16_16_ = auVar171;
    auVar92._0_16_ = auVar171;
    auVar171 = vfmadd213ps_fma(auVar92,auVar196,auVar167);
    auVar90 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar173));
    auVar172 = vfmadd213ps_fma(auVar90,auVar196,ZEXT1632(auVar173));
    auVar90 = vsubps_avx(ZEXT1632(auVar171),ZEXT1632(auVar159));
    auVar171 = vfmadd213ps_fma(auVar90,auVar196,ZEXT1632(auVar159));
    auVar90 = vsubps_avx(ZEXT1632(auVar171),ZEXT1632(auVar172));
    auVar175 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar90,auVar196);
    fVar229 = auVar90._4_4_ * 3.0;
    local_4e8._0_4_ = fVar72;
    fVar131 = fVar72 * 0.33333334;
    auVar187._0_8_ =
         CONCAT44(auVar175._4_4_ + fVar131 * fVar229,auVar175._0_4_ + fVar131 * auVar90._0_4_ * 3.0)
    ;
    auVar187._8_4_ = auVar175._8_4_ + fVar131 * auVar90._8_4_ * 3.0;
    auVar187._12_4_ = auVar175._12_4_ + fVar131 * auVar90._12_4_ * 3.0;
    auVar172 = vshufpd_avx(auVar175,auVar175,3);
    auVar173 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar171 = vsubps_avx(auVar172,auVar175);
    _local_508 = auVar173;
    auVar254 = vsubps_avx(auVar173,(undefined1  [16])0x0);
    auVar80._0_4_ = auVar171._0_4_ + auVar254._0_4_;
    auVar80._4_4_ = auVar171._4_4_ + auVar254._4_4_;
    auVar80._8_4_ = auVar171._8_4_ + auVar254._8_4_;
    auVar80._12_4_ = auVar171._12_4_ + auVar254._12_4_;
    auVar171 = vshufps_avx(auVar175,auVar175,0xb1);
    auVar254 = vshufps_avx(auVar187,auVar187,0xb1);
    auVar278._4_4_ = auVar80._0_4_;
    auVar278._0_4_ = auVar80._0_4_;
    auVar278._8_4_ = auVar80._0_4_;
    auVar278._12_4_ = auVar80._0_4_;
    auVar159 = vshufps_avx(auVar80,auVar80,0x55);
    fVar95 = auVar159._0_4_;
    auVar81._0_4_ = fVar95 * auVar171._0_4_;
    fVar96 = auVar159._4_4_;
    auVar81._4_4_ = fVar96 * auVar171._4_4_;
    fVar71 = auVar159._8_4_;
    auVar81._8_4_ = fVar71 * auVar171._8_4_;
    fVar70 = auVar159._12_4_;
    auVar81._12_4_ = fVar70 * auVar171._12_4_;
    auVar158._0_4_ = fVar95 * auVar254._0_4_;
    auVar158._4_4_ = fVar96 * auVar254._4_4_;
    auVar158._8_4_ = fVar71 * auVar254._8_4_;
    auVar158._12_4_ = fVar70 * auVar254._12_4_;
    auVar174 = vfmadd231ps_fma(auVar81,auVar278,auVar175);
    auVar247 = vfmadd231ps_fma(auVar158,auVar278,auVar187);
    auVar254 = vshufps_avx(auVar174,auVar174,0xe8);
    auVar159 = vshufps_avx(auVar247,auVar247,0xe8);
    auVar171 = vcmpps_avx(auVar254,auVar159,1);
    uVar64 = vextractps_avx(auVar171,0);
    auVar176 = auVar247;
    if ((uVar64 & 1) == 0) {
      auVar176 = auVar174;
    }
    auVar135._0_4_ = fVar131 * auVar90._16_4_ * 3.0;
    auVar135._4_4_ = fVar131 * fVar229;
    auVar135._8_4_ = fVar131 * auVar90._24_4_ * 3.0;
    auVar135._12_4_ = fVar131 * auVar227._28_4_;
    auVar204 = vsubps_avx((undefined1  [16])0x0,auVar135);
    auVar136 = vshufps_avx(auVar204,auVar204,0xb1);
    auVar185 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar188._0_4_ = fVar95 * auVar136._0_4_;
    auVar188._4_4_ = fVar96 * auVar136._4_4_;
    auVar188._8_4_ = fVar71 * auVar136._8_4_;
    auVar188._12_4_ = fVar70 * auVar136._12_4_;
    auVar206._0_4_ = auVar185._0_4_ * fVar95;
    auVar206._4_4_ = auVar185._4_4_ * fVar96;
    auVar206._8_4_ = auVar185._8_4_ * fVar71;
    auVar206._12_4_ = auVar185._12_4_ * fVar70;
    auVar205 = vfmadd231ps_fma(auVar188,auVar278,auVar204);
    auVar214 = vfmadd231ps_fma(auVar206,(undefined1  [16])0x0,auVar278);
    auVar185 = vshufps_avx(auVar205,auVar205,0xe8);
    auVar203 = vshufps_avx(auVar214,auVar214,0xe8);
    auVar227 = ZEXT1664(auVar203);
    auVar136 = vcmpps_avx(auVar185,auVar203,1);
    uVar64 = vextractps_avx(auVar136,0);
    auVar215 = auVar214;
    if ((uVar64 & 1) == 0) {
      auVar215 = auVar205;
    }
    auVar176 = vmaxss_avx(auVar215,auVar176);
    auVar254 = vminps_avx(auVar254,auVar159);
    auVar159 = vminps_avx(auVar185,auVar203);
    auVar159 = vminps_avx(auVar254,auVar159);
    auVar171 = vshufps_avx(auVar171,auVar171,0x55);
    auVar171 = vblendps_avx(auVar171,auVar136,2);
    auVar136 = vpslld_avx(auVar171,0x1f);
    auVar171 = vshufpd_avx(auVar247,auVar247,1);
    auVar171 = vinsertps_avx(auVar171,auVar214,0x9c);
    auVar254 = vshufpd_avx(auVar174,auVar174,1);
    auVar254 = vinsertps_avx(auVar254,auVar205,0x9c);
    auVar171 = vblendvps_avx(auVar254,auVar171,auVar136);
    auVar254 = vmovshdup_avx(auVar171);
    auVar171 = vmaxss_avx(auVar254,auVar171);
    fVar71 = auVar159._0_4_;
    auVar254 = vmovshdup_avx(auVar159);
    fVar96 = auVar171._0_4_;
    fVar131 = auVar254._0_4_;
    fVar95 = auVar176._0_4_;
    if (((0.0001 <= fVar71) || (fVar96 <= -0.0001)) && (0.0001 <= fVar131 || fVar96 <= -0.0001))
    goto code_r0x0135b756;
    goto LAB_0135b77c;
  }
  auVar113 = vinsertps_avx(auVar113,auVar170,0x10);
  goto LAB_0135ae99;
code_r0x0135b756:
  auVar254 = vcmpps_avx(auVar254,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar174 = vcmpps_avx(auVar159,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar254 = vandps_avx(auVar174,auVar254);
  if (fVar95 <= -0.0001 || (auVar254 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0135b449;
LAB_0135b77c:
  auVar174 = vcmpps_avx(auVar159,_DAT_01f45a50,1);
  auVar247 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar254 = vcmpss_avx(auVar176,ZEXT816(0) << 0x20,1);
  auVar105._8_4_ = 0x3f800000;
  auVar105._0_8_ = 0x3f8000003f800000;
  auVar105._12_4_ = 0x3f800000;
  auVar123._8_4_ = 0xbf800000;
  auVar123._0_8_ = 0xbf800000bf800000;
  auVar123._12_4_ = 0xbf800000;
  auVar254 = vblendvps_avx(auVar105,auVar123,auVar254);
  auVar174 = vblendvps_avx(auVar105,auVar123,auVar174);
  fVar229 = auVar174._0_4_;
  fVar70 = auVar254._0_4_;
  auVar254 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar229 == fVar70) && (!NAN(fVar229) && !NAN(fVar70))) {
    auVar254 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar229 == fVar70) && (!NAN(fVar229) && !NAN(fVar70))) {
    auVar247 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar174 = vmovshdup_avx(auVar174);
  fVar275 = auVar174._0_4_;
  if ((fVar229 != fVar275) || (NAN(fVar229) || NAN(fVar275))) {
    if ((fVar131 != fVar71) || (NAN(fVar131) || NAN(fVar71))) {
      auVar137._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
      auVar137._8_4_ = auVar159._8_4_ ^ 0x80000000;
      auVar137._12_4_ = auVar159._12_4_ ^ 0x80000000;
      auVar138._0_4_ = -fVar71 / (fVar131 - fVar71);
      auVar138._4_12_ = auVar137._4_12_;
      auVar159 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar138._0_4_)),auVar138,ZEXT416(0));
      auVar174 = auVar159;
    }
    else {
      auVar159 = ZEXT816(0) << 0x20;
      if ((fVar71 != 0.0) || (auVar174 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar71))) {
        auVar159 = SUB6416(ZEXT464(0x7f800000),0);
        auVar174 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar254 = vminss_avx(auVar254,auVar159);
    auVar247 = vmaxss_avx(auVar174,auVar247);
  }
  auVar171 = vcmpss_avx(auVar171,ZEXT416(0),1);
  auVar106._8_4_ = 0x3f800000;
  auVar106._0_8_ = 0x3f8000003f800000;
  auVar106._12_4_ = 0x3f800000;
  auVar124._8_4_ = 0xbf800000;
  auVar124._0_8_ = 0xbf800000bf800000;
  auVar124._12_4_ = 0xbf800000;
  auVar171 = vblendvps_avx(auVar106,auVar124,auVar171);
  fVar131 = auVar171._0_4_;
  if ((fVar70 != fVar131) || (NAN(fVar70) || NAN(fVar131))) {
    if ((fVar96 != fVar95) || (NAN(fVar96) || NAN(fVar95))) {
      auVar82._0_8_ = auVar176._0_8_ ^ 0x8000000080000000;
      auVar82._8_4_ = auVar176._8_4_ ^ 0x80000000;
      auVar82._12_4_ = auVar176._12_4_ ^ 0x80000000;
      auVar139._0_4_ = -fVar95 / (fVar96 - fVar95);
      auVar139._4_12_ = auVar82._4_12_;
      auVar171 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar139._0_4_)),auVar139,ZEXT416(0));
      auVar159 = auVar171;
    }
    else {
      auVar171 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar95 != 0.0) || (auVar159 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar95))) {
        auVar171 = SUB6416(ZEXT464(0xff800000),0);
        auVar159 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar254 = vminss_avx(auVar254,auVar159);
    auVar247 = vmaxss_avx(auVar171,auVar247);
  }
  if ((fVar275 != fVar131) || (NAN(fVar275) || NAN(fVar131))) {
    auVar254 = vminss_avx(auVar254,SUB6416(ZEXT464(0x3f800000),0));
    auVar247 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar247);
  }
  auVar171 = vmaxss_avx(ZEXT816(0) << 0x40,auVar254);
  auVar254 = vminss_avx(auVar247,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar254._0_4_ < auVar171._0_4_) goto LAB_0135b449;
  auVar171 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar171._0_4_ + -0.1)));
  auVar254 = vminss_avx(ZEXT416((uint)(auVar254._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar147._0_8_ = auVar175._0_8_;
  auVar147._8_8_ = auVar147._0_8_;
  auVar218._8_8_ = auVar187._0_8_;
  auVar218._0_8_ = auVar187._0_8_;
  auVar235._8_8_ = auVar204._0_8_;
  auVar235._0_8_ = auVar204._0_8_;
  auVar159 = vshufpd_avx(auVar187,auVar187,3);
  auVar174 = vshufpd_avx(auVar204,auVar204,3);
  auVar247 = vshufps_avx(auVar171,auVar254,0);
  auVar83._8_4_ = 0x3f800000;
  auVar83._0_8_ = 0x3f8000003f800000;
  auVar83._12_4_ = 0x3f800000;
  auVar175 = vsubps_avx(auVar83,auVar247);
  local_3d8 = auVar172._0_4_;
  fStack_3d4 = auVar172._4_4_;
  fStack_3d0 = auVar172._8_4_;
  fStack_3cc = auVar172._12_4_;
  fVar131 = auVar247._0_4_;
  auVar84._0_4_ = fVar131 * local_3d8;
  fVar95 = auVar247._4_4_;
  auVar84._4_4_ = fVar95 * fStack_3d4;
  fVar96 = auVar247._8_4_;
  auVar84._8_4_ = fVar96 * fStack_3d0;
  fVar71 = auVar247._12_4_;
  auVar84._12_4_ = fVar71 * fStack_3cc;
  auVar179._0_4_ = fVar131 * auVar159._0_4_;
  auVar179._4_4_ = fVar95 * auVar159._4_4_;
  auVar179._8_4_ = fVar96 * auVar159._8_4_;
  auVar179._12_4_ = fVar71 * auVar159._12_4_;
  auVar189._0_4_ = fVar131 * auVar174._0_4_;
  auVar189._4_4_ = fVar95 * auVar174._4_4_;
  auVar189._8_4_ = fVar96 * auVar174._8_4_;
  auVar189._12_4_ = fVar71 * auVar174._12_4_;
  local_508._0_4_ = auVar173._0_4_;
  local_508._4_4_ = auVar173._4_4_;
  fStack_500 = auVar173._8_4_;
  fStack_4fc = auVar173._12_4_;
  auVar207._0_4_ = fVar131 * (float)local_508._0_4_;
  auVar207._4_4_ = fVar95 * (float)local_508._4_4_;
  auVar207._8_4_ = fVar96 * fStack_500;
  auVar207._12_4_ = fVar71 * fStack_4fc;
  auVar159 = vfmadd231ps_fma(auVar84,auVar175,auVar147);
  auVar174 = vfmadd231ps_fma(auVar179,auVar175,auVar218);
  auVar247 = vfmadd231ps_fma(auVar189,auVar175,auVar235);
  auVar175 = vfmadd231ps_fma(auVar207,auVar175,ZEXT816(0));
  auVar172 = vmovshdup_avx(auVar77);
  auVar203 = vfmadd231ss_fma(ZEXT416((uint)(auVar172._0_4_ * auVar171._0_4_)),auVar77,
                             ZEXT416((uint)(1.0 - auVar171._0_4_)));
  auVar204 = vfmadd231ss_fma(ZEXT416((uint)(auVar172._0_4_ * auVar254._0_4_)),auVar77,
                             ZEXT416((uint)(1.0 - auVar254._0_4_)));
  fVar131 = 1.0 / fVar72;
  auVar77 = vsubps_avx(auVar174,auVar159);
  auVar219._0_4_ = auVar77._0_4_ * 3.0;
  auVar219._4_4_ = auVar77._4_4_ * 3.0;
  auVar219._8_4_ = auVar77._8_4_ * 3.0;
  auVar219._12_4_ = auVar77._12_4_ * 3.0;
  auVar77 = vsubps_avx(auVar247,auVar174);
  auVar236._0_4_ = auVar77._0_4_ * 3.0;
  auVar236._4_4_ = auVar77._4_4_ * 3.0;
  auVar236._8_4_ = auVar77._8_4_ * 3.0;
  auVar236._12_4_ = auVar77._12_4_ * 3.0;
  auVar77 = vsubps_avx(auVar175,auVar247);
  auVar248._0_4_ = auVar77._0_4_ * 3.0;
  auVar248._4_4_ = auVar77._4_4_ * 3.0;
  auVar248._8_4_ = auVar77._8_4_ * 3.0;
  auVar248._12_4_ = auVar77._12_4_ * 3.0;
  auVar171 = vminps_avx(auVar236,auVar248);
  auVar77 = vmaxps_avx(auVar236,auVar248);
  auVar171 = vminps_avx(auVar219,auVar171);
  auVar77 = vmaxps_avx(auVar219,auVar77);
  auVar172 = vshufpd_avx(auVar171,auVar171,3);
  auVar173 = vshufpd_avx(auVar77,auVar77,3);
  auVar171 = vminps_avx(auVar171,auVar172);
  auVar77 = vmaxps_avx(auVar77,auVar173);
  auVar237._0_4_ = auVar171._0_4_ * fVar131;
  auVar237._4_4_ = auVar171._4_4_ * fVar131;
  auVar237._8_4_ = auVar171._8_4_ * fVar131;
  auVar237._12_4_ = auVar171._12_4_ * fVar131;
  auVar220._0_4_ = auVar77._0_4_ * fVar131;
  auVar220._4_4_ = auVar77._4_4_ * fVar131;
  auVar220._8_4_ = auVar77._8_4_ * fVar131;
  auVar220._12_4_ = auVar77._12_4_ * fVar131;
  fVar131 = 1.0 / (auVar204._0_4_ - auVar203._0_4_);
  auVar77 = vshufpd_avx(auVar159,auVar159,3);
  auVar171 = vshufpd_avx(auVar174,auVar174,3);
  auVar172 = vshufpd_avx(auVar247,auVar247,3);
  auVar173 = vshufpd_avx(auVar175,auVar175,3);
  auVar77 = vsubps_avx(auVar77,auVar159);
  auVar254 = vsubps_avx(auVar171,auVar174);
  auVar159 = vsubps_avx(auVar172,auVar247);
  auVar173 = vsubps_avx(auVar173,auVar175);
  auVar171 = vminps_avx(auVar77,auVar254);
  auVar77 = vmaxps_avx(auVar77,auVar254);
  auVar172 = vminps_avx(auVar159,auVar173);
  auVar172 = vminps_avx(auVar171,auVar172);
  auVar171 = vmaxps_avx(auVar159,auVar173);
  auVar77 = vmaxps_avx(auVar77,auVar171);
  auVar266._0_4_ = fVar131 * auVar172._0_4_;
  auVar266._4_4_ = fVar131 * auVar172._4_4_;
  auVar266._8_4_ = fVar131 * auVar172._8_4_;
  auVar266._12_4_ = fVar131 * auVar172._12_4_;
  auVar255._0_4_ = fVar131 * auVar77._0_4_;
  auVar255._4_4_ = fVar131 * auVar77._4_4_;
  auVar255._8_4_ = fVar131 * auVar77._8_4_;
  auVar255._12_4_ = fVar131 * auVar77._12_4_;
  auVar173 = vinsertps_avx(auVar113,auVar203,0x10);
  auVar254 = vinsertps_avx(auVar170,auVar204,0x10);
  auVar249._0_4_ = (auVar173._0_4_ + auVar254._0_4_) * 0.5;
  auVar249._4_4_ = (auVar173._4_4_ + auVar254._4_4_) * 0.5;
  auVar249._8_4_ = (auVar173._8_4_ + auVar254._8_4_) * 0.5;
  auVar249._12_4_ = (auVar173._12_4_ + auVar254._12_4_) * 0.5;
  auVar85._4_4_ = auVar249._0_4_;
  auVar85._0_4_ = auVar249._0_4_;
  auVar85._8_4_ = auVar249._0_4_;
  auVar85._12_4_ = auVar249._0_4_;
  auVar170 = vfmadd213ps_fma(auVar16,auVar85,auVar5);
  auVar171 = vfmadd213ps_fma(auVar4,auVar85,auVar6);
  auVar172 = vfmadd213ps_fma(auVar132,auVar85,auVar7);
  auVar77 = vsubps_avx(auVar171,auVar170);
  auVar170 = vfmadd213ps_fma(auVar77,auVar85,auVar170);
  auVar77 = vsubps_avx(auVar172,auVar171);
  auVar77 = vfmadd213ps_fma(auVar77,auVar85,auVar171);
  auVar77 = vsubps_avx(auVar77,auVar170);
  auVar170 = vfmadd231ps_fma(auVar170,auVar77,auVar85);
  auVar86._0_8_ = CONCAT44(auVar77._4_4_ * 3.0,auVar77._0_4_ * 3.0);
  auVar86._8_4_ = auVar77._8_4_ * 3.0;
  auVar86._12_4_ = auVar77._12_4_ * 3.0;
  auVar279._8_8_ = auVar170._0_8_;
  auVar279._0_8_ = auVar170._0_8_;
  auVar77 = vshufpd_avx(auVar170,auVar170,3);
  auVar170 = vshufps_avx(auVar249,auVar249,0x55);
  auVar174 = vsubps_avx(auVar77,auVar279);
  auVar175 = vfmadd231ps_fma(auVar279,auVar170,auVar174);
  auVar288._8_8_ = auVar86._0_8_;
  auVar288._0_8_ = auVar86._0_8_;
  auVar77 = vshufpd_avx(auVar86,auVar86,3);
  auVar77 = vsubps_avx(auVar77,auVar288);
  auVar247 = vfmadd213ps_fma(auVar77,auVar170,auVar288);
  auVar170 = vmovshdup_avx(auVar247);
  auVar289._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
  auVar289._8_4_ = auVar170._8_4_ ^ 0x80000000;
  auVar289._12_4_ = auVar170._12_4_ ^ 0x80000000;
  auVar171 = vmovshdup_avx(auVar174);
  auVar77 = vunpcklps_avx(auVar171,auVar289);
  auVar172 = vshufps_avx(auVar77,auVar289,4);
  auVar159 = vshufps_avx(auVar249,auVar249,0x54);
  auVar140._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
  auVar140._8_4_ = auVar174._8_4_ ^ 0x80000000;
  auVar140._12_4_ = auVar174._12_4_ ^ 0x80000000;
  auVar77 = vmovlhps_avx(auVar140,auVar247);
  auVar77 = vshufps_avx(auVar77,auVar247,8);
  auVar170 = vfmsub231ss_fma(ZEXT416((uint)(auVar174._0_4_ * auVar170._0_4_)),auVar171,auVar247);
  uVar65 = auVar170._0_4_;
  auVar87._4_4_ = uVar65;
  auVar87._0_4_ = uVar65;
  auVar87._8_4_ = uVar65;
  auVar87._12_4_ = uVar65;
  auVar170 = vdivps_avx(auVar172,auVar87);
  auVar171 = vdivps_avx(auVar77,auVar87);
  fVar96 = auVar175._0_4_;
  fVar131 = auVar170._0_4_;
  auVar77 = vshufps_avx(auVar175,auVar175,0x55);
  fVar95 = auVar171._0_4_;
  auVar88._0_4_ = fVar96 * fVar131 + auVar77._0_4_ * fVar95;
  auVar88._4_4_ = fVar96 * auVar170._4_4_ + auVar77._4_4_ * auVar171._4_4_;
  auVar88._8_4_ = fVar96 * auVar170._8_4_ + auVar77._8_4_ * auVar171._8_4_;
  auVar88._12_4_ = fVar96 * auVar170._12_4_ + auVar77._12_4_ * auVar171._12_4_;
  auVar185 = vsubps_avx(auVar159,auVar88);
  auVar159 = vmovshdup_avx(auVar170);
  auVar77 = vinsertps_avx(auVar237,auVar266,0x1c);
  auVar160._0_4_ = auVar159._0_4_ * auVar77._0_4_;
  auVar160._4_4_ = auVar159._4_4_ * auVar77._4_4_;
  auVar160._8_4_ = auVar159._8_4_ * auVar77._8_4_;
  auVar160._12_4_ = auVar159._12_4_ * auVar77._12_4_;
  auVar172 = vinsertps_avx(auVar220,auVar255,0x1c);
  auVar107._0_4_ = auVar172._0_4_ * auVar159._0_4_;
  auVar107._4_4_ = auVar172._4_4_ * auVar159._4_4_;
  auVar107._8_4_ = auVar172._8_4_ * auVar159._8_4_;
  auVar107._12_4_ = auVar172._12_4_ * auVar159._12_4_;
  auVar175 = vminps_avx(auVar160,auVar107);
  auVar247 = vmaxps_avx(auVar107,auVar160);
  auVar159 = vinsertps_avx(auVar266,auVar237,0x4c);
  auVar176 = vmovshdup_avx(auVar171);
  auVar174 = vinsertps_avx(auVar255,auVar220,0x4c);
  auVar256._0_4_ = auVar176._0_4_ * auVar159._0_4_;
  auVar256._4_4_ = auVar176._4_4_ * auVar159._4_4_;
  auVar256._8_4_ = auVar176._8_4_ * auVar159._8_4_;
  auVar256._12_4_ = auVar176._12_4_ * auVar159._12_4_;
  auVar238._0_4_ = auVar176._0_4_ * auVar174._0_4_;
  auVar238._4_4_ = auVar176._4_4_ * auVar174._4_4_;
  auVar238._8_4_ = auVar176._8_4_ * auVar174._8_4_;
  auVar238._12_4_ = auVar176._12_4_ * auVar174._12_4_;
  auVar176 = vminps_avx(auVar256,auVar238);
  auVar267._0_4_ = auVar175._0_4_ + auVar176._0_4_;
  auVar267._4_4_ = auVar175._4_4_ + auVar176._4_4_;
  auVar267._8_4_ = auVar175._8_4_ + auVar176._8_4_;
  auVar267._12_4_ = auVar175._12_4_ + auVar176._12_4_;
  auVar175 = vmaxps_avx(auVar238,auVar256);
  auVar108._0_4_ = auVar175._0_4_ + auVar247._0_4_;
  auVar108._4_4_ = auVar175._4_4_ + auVar247._4_4_;
  auVar108._8_4_ = auVar175._8_4_ + auVar247._8_4_;
  auVar108._12_4_ = auVar175._12_4_ + auVar247._12_4_;
  auVar239._8_8_ = 0x3f80000000000000;
  auVar239._0_8_ = 0x3f80000000000000;
  auVar247 = vsubps_avx(auVar239,auVar108);
  auVar175 = vsubps_avx(auVar239,auVar267);
  auVar176 = vsubps_avx(auVar173,auVar249);
  auVar136 = vsubps_avx(auVar254,auVar249);
  auVar125._0_4_ = fVar131 * auVar77._0_4_;
  auVar125._4_4_ = fVar131 * auVar77._4_4_;
  auVar125._8_4_ = fVar131 * auVar77._8_4_;
  auVar125._12_4_ = fVar131 * auVar77._12_4_;
  auVar268._0_4_ = fVar131 * auVar172._0_4_;
  auVar268._4_4_ = fVar131 * auVar172._4_4_;
  auVar268._8_4_ = fVar131 * auVar172._8_4_;
  auVar268._12_4_ = fVar131 * auVar172._12_4_;
  auVar172 = vminps_avx(auVar125,auVar268);
  auVar77 = vmaxps_avx(auVar268,auVar125);
  auVar161._0_4_ = fVar95 * auVar159._0_4_;
  auVar161._4_4_ = fVar95 * auVar159._4_4_;
  auVar161._8_4_ = fVar95 * auVar159._8_4_;
  auVar161._12_4_ = fVar95 * auVar159._12_4_;
  auVar221._0_4_ = fVar95 * auVar174._0_4_;
  auVar221._4_4_ = fVar95 * auVar174._4_4_;
  auVar221._8_4_ = fVar95 * auVar174._8_4_;
  auVar221._12_4_ = fVar95 * auVar174._12_4_;
  auVar159 = vminps_avx(auVar161,auVar221);
  auVar269._0_4_ = auVar172._0_4_ + auVar159._0_4_;
  auVar269._4_4_ = auVar172._4_4_ + auVar159._4_4_;
  auVar269._8_4_ = auVar172._8_4_ + auVar159._8_4_;
  auVar269._12_4_ = auVar172._12_4_ + auVar159._12_4_;
  fVar275 = auVar176._0_4_;
  auVar280._0_4_ = fVar275 * auVar247._0_4_;
  fVar276 = auVar176._4_4_;
  auVar280._4_4_ = fVar276 * auVar247._4_4_;
  fVar197 = auVar176._8_4_;
  auVar280._8_4_ = fVar197 * auVar247._8_4_;
  fVar198 = auVar176._12_4_;
  auVar280._12_4_ = fVar198 * auVar247._12_4_;
  auVar172 = vmaxps_avx(auVar221,auVar161);
  auVar222._0_4_ = fVar275 * auVar175._0_4_;
  auVar222._4_4_ = fVar276 * auVar175._4_4_;
  auVar222._8_4_ = fVar197 * auVar175._8_4_;
  auVar222._12_4_ = fVar198 * auVar175._12_4_;
  fVar96 = auVar136._0_4_;
  auVar109._0_4_ = fVar96 * auVar247._0_4_;
  fVar71 = auVar136._4_4_;
  auVar109._4_4_ = fVar71 * auVar247._4_4_;
  fVar70 = auVar136._8_4_;
  auVar109._8_4_ = fVar70 * auVar247._8_4_;
  fVar229 = auVar136._12_4_;
  auVar109._12_4_ = fVar229 * auVar247._12_4_;
  auVar240._0_4_ = fVar96 * auVar175._0_4_;
  auVar240._4_4_ = fVar71 * auVar175._4_4_;
  auVar240._8_4_ = fVar70 * auVar175._8_4_;
  auVar240._12_4_ = fVar229 * auVar175._12_4_;
  auVar126._0_4_ = auVar77._0_4_ + auVar172._0_4_;
  auVar126._4_4_ = auVar77._4_4_ + auVar172._4_4_;
  auVar126._8_4_ = auVar77._8_4_ + auVar172._8_4_;
  auVar126._12_4_ = auVar77._12_4_ + auVar172._12_4_;
  auVar162._8_8_ = 0x3f800000;
  auVar162._0_8_ = 0x3f800000;
  auVar77 = vsubps_avx(auVar162,auVar126);
  auVar172 = vsubps_avx(auVar162,auVar269);
  auVar270._0_4_ = fVar275 * auVar77._0_4_;
  auVar270._4_4_ = fVar276 * auVar77._4_4_;
  auVar270._8_4_ = fVar197 * auVar77._8_4_;
  auVar270._12_4_ = fVar198 * auVar77._12_4_;
  auVar257._0_4_ = fVar275 * auVar172._0_4_;
  auVar257._4_4_ = fVar276 * auVar172._4_4_;
  auVar257._8_4_ = fVar197 * auVar172._8_4_;
  auVar257._12_4_ = fVar198 * auVar172._12_4_;
  auVar127._0_4_ = fVar96 * auVar77._0_4_;
  auVar127._4_4_ = fVar71 * auVar77._4_4_;
  auVar127._8_4_ = fVar70 * auVar77._8_4_;
  auVar127._12_4_ = fVar229 * auVar77._12_4_;
  auVar163._0_4_ = fVar96 * auVar172._0_4_;
  auVar163._4_4_ = fVar71 * auVar172._4_4_;
  auVar163._8_4_ = fVar70 * auVar172._8_4_;
  auVar163._12_4_ = fVar229 * auVar172._12_4_;
  auVar77 = vminps_avx(auVar270,auVar257);
  auVar172 = vminps_avx(auVar127,auVar163);
  auVar77 = vminps_avx(auVar77,auVar172);
  auVar172 = vmaxps_avx(auVar257,auVar270);
  auVar159 = vmaxps_avx(auVar163,auVar127);
  auVar174 = vminps_avx(auVar280,auVar222);
  auVar247 = vminps_avx(auVar109,auVar240);
  auVar174 = vminps_avx(auVar174,auVar247);
  auVar77 = vhaddps_avx(auVar77,auVar174);
  auVar172 = vmaxps_avx(auVar159,auVar172);
  auVar159 = vmaxps_avx(auVar222,auVar280);
  auVar174 = vmaxps_avx(auVar240,auVar109);
  auVar159 = vmaxps_avx(auVar174,auVar159);
  auVar172 = vhaddps_avx(auVar172,auVar159);
  auVar77 = vshufps_avx(auVar77,auVar77,0xe8);
  auVar172 = vshufps_avx(auVar172,auVar172,0xe8);
  auVar241._0_4_ = auVar185._0_4_ + auVar77._0_4_;
  auVar241._4_4_ = auVar185._4_4_ + auVar77._4_4_;
  auVar241._8_4_ = auVar185._8_4_ + auVar77._8_4_;
  auVar241._12_4_ = auVar185._12_4_ + auVar77._12_4_;
  auVar223._0_4_ = auVar185._0_4_ + auVar172._0_4_;
  auVar223._4_4_ = auVar185._4_4_ + auVar172._4_4_;
  auVar223._8_4_ = auVar185._8_4_ + auVar172._8_4_;
  auVar223._12_4_ = auVar185._12_4_ + auVar172._12_4_;
  auVar227 = ZEXT1664(auVar223);
  auVar77 = vmaxps_avx(auVar173,auVar241);
  auVar172 = vminps_avx(auVar223,auVar254);
  auVar77 = vcmpps_avx(auVar172,auVar77,1);
  auVar77 = vshufps_avx(auVar77,auVar77,0x50);
  if ((auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar77[0xf] < '\0')
  goto LAB_0135b449;
  bVar63 = 0;
  if ((auVar196._0_4_ < auVar241._0_4_) && (bVar63 = 0, auVar223._0_4_ < auVar254._0_4_)) {
    auVar172 = vmovshdup_avx(auVar241);
    auVar77 = vcmpps_avx(auVar223,auVar254,1);
    bVar63 = auVar77[4] & auVar203._0_4_ < auVar172._0_4_;
  }
  auVar227 = ZEXT1664(auVar8);
  if (((3 < (uint)uVar68 || fVar72 < 0.001) | bVar63) == 1) {
    lVar62 = 0xc9;
    do {
      lVar62 = lVar62 + -1;
      if (lVar62 == 0) goto LAB_0135b449;
      fVar71 = auVar185._0_4_;
      fVar96 = 1.0 - fVar71;
      fVar72 = fVar96 * fVar96 * fVar96;
      fVar98 = fVar71 * 3.0 * fVar96 * fVar96;
      fVar96 = fVar96 * fVar71 * fVar71 * 3.0;
      auVar148._4_4_ = fVar72;
      auVar148._0_4_ = fVar72;
      auVar148._8_4_ = fVar72;
      auVar148._12_4_ = fVar72;
      auVar128._4_4_ = fVar98;
      auVar128._0_4_ = fVar98;
      auVar128._8_4_ = fVar98;
      auVar128._12_4_ = fVar98;
      auVar110._4_4_ = fVar96;
      auVar110._0_4_ = fVar96;
      auVar110._8_4_ = fVar96;
      auVar110._12_4_ = fVar96;
      fVar71 = fVar71 * fVar71 * fVar71;
      auVar164._0_4_ = auVar8._0_4_ * fVar71;
      auVar164._4_4_ = auVar8._4_4_ * fVar71;
      auVar164._8_4_ = auVar8._8_4_ * fVar71;
      auVar164._12_4_ = auVar8._12_4_ * fVar71;
      auVar113 = vfmadd231ps_fma(auVar164,auVar7,auVar110);
      auVar113 = vfmadd231ps_fma(auVar113,auVar6,auVar128);
      auVar113 = vfmadd231ps_fma(auVar113,auVar5,auVar148);
      auVar111._8_8_ = auVar113._0_8_;
      auVar111._0_8_ = auVar113._0_8_;
      auVar113 = vshufpd_avx(auVar113,auVar113,3);
      auVar77 = vshufps_avx(auVar185,auVar185,0x55);
      auVar113 = vsubps_avx(auVar113,auVar111);
      auVar77 = vfmadd213ps_fma(auVar113,auVar77,auVar111);
      fVar72 = auVar77._0_4_;
      auVar113 = vshufps_avx(auVar77,auVar77,0x55);
      auVar112._0_4_ = fVar131 * fVar72 + fVar95 * auVar113._0_4_;
      auVar112._4_4_ = auVar170._4_4_ * fVar72 + auVar171._4_4_ * auVar113._4_4_;
      auVar112._8_4_ = auVar170._8_4_ * fVar72 + auVar171._8_4_ * auVar113._8_4_;
      auVar112._12_4_ = auVar170._12_4_ * fVar72 + auVar171._12_4_ * auVar113._12_4_;
      auVar185 = vsubps_avx(auVar185,auVar112);
      auVar113 = vandps_avx(auVar233,auVar77);
      auVar77 = vshufps_avx(auVar113,auVar113,0xf5);
      auVar113 = vmaxss_avx(auVar77,auVar113);
    } while (fVar94 <= auVar113._0_4_);
    fVar72 = auVar185._0_4_;
    if ((0.0 <= fVar72) && (fVar72 <= 1.0)) {
      auVar113 = vmovshdup_avx(auVar185);
      fVar98 = auVar113._0_4_;
      if ((0.0 <= fVar98) && (fVar98 <= 1.0)) {
        auVar113 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar159 = vinsertps_avx(auVar113,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar113 = vdpps_avx(auVar159,auVar153,0x7f);
        auVar77 = vdpps_avx(auVar159,auVar74,0x7f);
        auVar170 = vdpps_avx(auVar159,auVar102,0x7f);
        auVar171 = vdpps_avx(auVar159,auVar100,0x7f);
        auVar172 = vdpps_avx(auVar159,auVar103,0x7f);
        auVar173 = vdpps_avx(auVar159,auVar120,0x7f);
        auVar254 = vdpps_avx(auVar159,auVar121,0x7f);
        auVar159 = vdpps_avx(auVar159,auVar17,0x7f);
        fVar131 = 1.0 - fVar98;
        auVar113 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * auVar172._0_4_)),ZEXT416((uint)fVar131),
                                   auVar113);
        auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar173._0_4_ * fVar98)),ZEXT416((uint)fVar131),
                                  auVar77);
        auVar170 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ * fVar98)),ZEXT416((uint)fVar131),
                                   auVar170);
        auVar227 = ZEXT1664(auVar170);
        auVar171 = vfmadd231ss_fma(ZEXT416((uint)(fVar98 * auVar159._0_4_)),ZEXT416((uint)fVar131),
                                   auVar171);
        fVar71 = 1.0 - fVar72;
        fVar131 = fVar71 * fVar72 * fVar72 * 3.0;
        fVar229 = fVar72 * fVar72 * fVar72;
        auVar170 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * auVar171._0_4_)),ZEXT416((uint)fVar131),
                                   auVar170);
        fVar95 = fVar72 * 3.0 * fVar71 * fVar71;
        auVar77 = vfmadd231ss_fma(auVar170,ZEXT416((uint)fVar95),auVar77);
        fVar96 = fVar71 * fVar71 * fVar71;
        auVar113 = vfmadd231ss_fma(auVar77,ZEXT416((uint)fVar96),auVar113);
        fVar70 = auVar113._0_4_;
        if (((fVar69 <= fVar70) && (fVar275 = *(float *)(ray + k * 4 + 0x80), fVar70 <= fVar275)) &&
           (pGVar12 = (context->scene->geometries).items[uVar61].ptr,
           (pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar113 = vshufps_avx(auVar185,auVar185,0x55);
          auVar224._8_4_ = 0x3f800000;
          auVar224._0_8_ = 0x3f8000003f800000;
          auVar224._12_4_ = 0x3f800000;
          auVar77 = vsubps_avx(auVar224,auVar113);
          fVar276 = auVar113._0_4_;
          auVar242._0_4_ = fVar276 * auVar232._0_4_;
          fVar197 = auVar113._4_4_;
          auVar242._4_4_ = fVar197 * auVar232._4_4_;
          fVar198 = auVar113._8_4_;
          auVar242._8_4_ = fVar198 * auVar232._8_4_;
          fVar199 = auVar113._12_4_;
          auVar242._12_4_ = fVar199 * auVar232._12_4_;
          auVar250._0_4_ = fVar276 * auVar75._0_4_;
          auVar250._4_4_ = fVar197 * auVar75._4_4_;
          auVar250._8_4_ = fVar198 * auVar75._8_4_;
          auVar250._12_4_ = fVar199 * auVar75._12_4_;
          local_498 = auVar101._0_4_;
          fStack_494 = auVar101._4_4_;
          fStack_490 = auVar101._8_4_;
          fStack_48c = auVar101._12_4_;
          auVar258._0_4_ = fVar276 * local_498;
          auVar258._4_4_ = fVar197 * fStack_494;
          auVar258._8_4_ = fVar198 * fStack_490;
          auVar258._12_4_ = fVar199 * fStack_48c;
          auVar271._0_4_ = fVar276 * fVar168;
          auVar271._4_4_ = fVar197 * fVar182;
          auVar271._8_4_ = fVar198 * fVar183;
          auVar271._12_4_ = fVar199 * fVar184;
          auVar170 = vfmadd231ps_fma(auVar242,auVar77,auVar231);
          auVar171 = vfmadd231ps_fma(auVar250,auVar77,auVar134);
          auVar172 = vfmadd231ps_fma(auVar258,auVar77,auVar73);
          auVar173 = vfmadd231ps_fma(auVar271,auVar77,auVar9);
          auVar77 = vsubps_avx(auVar171,auVar170);
          auVar170 = vsubps_avx(auVar172,auVar171);
          auVar171 = vsubps_avx(auVar173,auVar172);
          local_238._4_4_ = fVar72;
          local_238._0_4_ = fVar72;
          local_238._8_4_ = fVar72;
          local_238._12_4_ = fVar72;
          auVar227 = ZEXT1664(local_238);
          auVar272._0_4_ = fVar72 * auVar170._0_4_;
          auVar272._4_4_ = fVar72 * auVar170._4_4_;
          auVar272._8_4_ = fVar72 * auVar170._8_4_;
          auVar272._12_4_ = fVar72 * auVar170._12_4_;
          auVar208._4_4_ = fVar71;
          auVar208._0_4_ = fVar71;
          auVar208._8_4_ = fVar71;
          auVar208._12_4_ = fVar71;
          auVar77 = vfmadd231ps_fma(auVar272,auVar208,auVar77);
          auVar243._0_4_ = fVar72 * auVar171._0_4_;
          auVar243._4_4_ = fVar72 * auVar171._4_4_;
          auVar243._8_4_ = fVar72 * auVar171._8_4_;
          auVar243._12_4_ = fVar72 * auVar171._12_4_;
          auVar170 = vfmadd231ps_fma(auVar243,auVar208,auVar170);
          auVar244._0_4_ = fVar72 * auVar170._0_4_;
          auVar244._4_4_ = fVar72 * auVar170._4_4_;
          auVar244._8_4_ = fVar72 * auVar170._8_4_;
          auVar244._12_4_ = fVar72 * auVar170._12_4_;
          auVar170 = vfmadd231ps_fma(auVar244,auVar208,auVar77);
          local_398 = auVar26._0_4_;
          fStack_394 = auVar26._4_4_;
          fStack_390 = auVar26._8_4_;
          fStack_38c = auVar26._12_4_;
          auVar190._0_4_ = fVar229 * local_398;
          auVar190._4_4_ = fVar229 * fStack_394;
          auVar190._8_4_ = fVar229 * fStack_390;
          auVar190._12_4_ = fVar229 * fStack_38c;
          auVar149._4_4_ = fVar131;
          auVar149._0_4_ = fVar131;
          auVar149._8_4_ = fVar131;
          auVar149._12_4_ = fVar131;
          auVar77 = vfmadd132ps_fma(auVar149,auVar190,auVar144);
          auVar180._4_4_ = fVar95;
          auVar180._0_4_ = fVar95;
          auVar180._8_4_ = fVar95;
          auVar180._12_4_ = fVar95;
          auVar77 = vfmadd132ps_fma(auVar180,auVar77,auVar133);
          auVar191._0_4_ = auVar170._0_4_ * 3.0;
          auVar191._4_4_ = auVar170._4_4_ * 3.0;
          auVar191._8_4_ = auVar170._8_4_ * 3.0;
          auVar191._12_4_ = auVar170._12_4_ * 3.0;
          auVar165._4_4_ = fVar96;
          auVar165._0_4_ = fVar96;
          auVar165._8_4_ = fVar96;
          auVar165._12_4_ = fVar96;
          auVar170 = vfmadd132ps_fma(auVar165,auVar77,auVar76);
          auVar77 = vshufps_avx(auVar191,auVar191,0xc9);
          auVar150._0_4_ = auVar170._0_4_ * auVar77._0_4_;
          auVar150._4_4_ = auVar170._4_4_ * auVar77._4_4_;
          auVar150._8_4_ = auVar170._8_4_ * auVar77._8_4_;
          auVar150._12_4_ = auVar170._12_4_ * auVar77._12_4_;
          auVar77 = vshufps_avx(auVar170,auVar170,0xc9);
          auVar77 = vfmsub231ps_fma(auVar150,auVar191,auVar77);
          local_248 = auVar77._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar70;
            uVar65 = vextractps_avx(auVar77,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar65;
            uVar65 = vextractps_avx(auVar77,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar65;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_248;
            *(float *)(ray + k * 4 + 0xf0) = fVar72;
            *(float *)(ray + k * 4 + 0x100) = fVar98;
            *(uint *)(ray + k * 4 + 0x110) = uVar11;
            *(uint *)(ray + k * 4 + 0x120) = uVar61;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar170 = vshufps_avx(auVar77,auVar77,0x55);
            auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
            local_268[0] = (RTCHitN)auVar170[0];
            local_268[1] = (RTCHitN)auVar170[1];
            local_268[2] = (RTCHitN)auVar170[2];
            local_268[3] = (RTCHitN)auVar170[3];
            local_268[4] = (RTCHitN)auVar170[4];
            local_268[5] = (RTCHitN)auVar170[5];
            local_268[6] = (RTCHitN)auVar170[6];
            local_268[7] = (RTCHitN)auVar170[7];
            local_268[8] = (RTCHitN)auVar170[8];
            local_268[9] = (RTCHitN)auVar170[9];
            local_268[10] = (RTCHitN)auVar170[10];
            local_268[0xb] = (RTCHitN)auVar170[0xb];
            local_268[0xc] = (RTCHitN)auVar170[0xc];
            local_268[0xd] = (RTCHitN)auVar170[0xd];
            local_268[0xe] = (RTCHitN)auVar170[0xe];
            local_268[0xf] = (RTCHitN)auVar170[0xf];
            local_258 = auVar77;
            uStack_244 = local_248;
            uStack_240 = local_248;
            uStack_23c = local_248;
            local_228 = auVar113;
            local_218 = CONCAT44(uVar11,uVar11);
            uStack_210 = CONCAT44(uVar11,uVar11);
            local_208._4_4_ = uVar61;
            local_208._0_4_ = uVar61;
            local_208._8_4_ = uVar61;
            local_208._12_4_ = uVar61;
            vpcmpeqd_avx2(ZEXT1632(local_208),ZEXT1632(local_208));
            uStack_1f4 = context->user->instID[0];
            local_1f8 = uStack_1f4;
            uStack_1f0 = uStack_1f4;
            uStack_1ec = uStack_1f4;
            uStack_1e8 = context->user->instPrimID[0];
            uStack_1e4 = uStack_1e8;
            uStack_1e0 = uStack_1e8;
            uStack_1dc = uStack_1e8;
            *(float *)(ray + k * 4 + 0x80) = fVar70;
            local_528 = *local_510;
            args.valid = (int *)local_528;
            args.geometryUserPtr = pGVar12->userPtr;
            args.context = context->user;
            args.hit = local_268;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar227 = ZEXT1664(local_238);
              (*pGVar12->intersectionFilterN)(&args);
              auVar119._8_56_ = extraout_var;
              auVar119._0_8_ = extraout_XMM1_Qa;
              auVar77 = auVar119._0_16_;
            }
            if (local_528 == (undefined1  [16])0x0) {
              auVar113 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar77 = vpcmpeqd_avx(auVar77,auVar77);
              auVar113 = auVar113 ^ auVar77;
            }
            else {
              p_Var13 = context->args->filter;
              auVar77 = vpcmpeqd_avx(auVar113,auVar113);
              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0))))
              {
                auVar227 = ZEXT1664(auVar227._0_16_);
                (*p_Var13)(&args);
                auVar77 = vpcmpeqd_avx(auVar77,auVar77);
              }
              auVar170 = vpcmpeqd_avx(local_528,_DAT_01f45a50);
              auVar113 = auVar170 ^ auVar77;
              if (local_528 != (undefined1  [16])0x0) {
                auVar170 = auVar170 ^ auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar77;
                auVar77 = vmaskmovps_avx(auVar170,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar77;
              }
            }
            auVar89._8_8_ = 0x100000001;
            auVar89._0_8_ = 0x100000001;
            if ((auVar89 & auVar113) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar275;
            }
          }
        }
      }
    }
    goto LAB_0135b449;
  }
  auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)fVar98),0x10);
  auVar77 = vinsertps_avx(auVar203,ZEXT416((uint)auVar204._0_4_),0x10);
  goto LAB_0135ae99;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }